

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

void embree::avx2::CurveNiIntersectorK<4,4>::
     intersect_hn<embree::avx2::OrientedCurve1IntersectorK<embree::HermiteCurveT,4>,embree::avx2::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  BBox1f BVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  Primitive PVar3;
  uint uVar4;
  Geometry *pGVar5;
  long lVar6;
  __int_type_conflict _Var7;
  RTCFilterFunctionN p_Var8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [32];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  int iVar22;
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  uint uVar47;
  ulong uVar48;
  ulong uVar49;
  long lVar50;
  byte bVar51;
  uint uVar52;
  uint uVar53;
  undefined4 uVar54;
  undefined8 unaff_RBP;
  uint uVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar84;
  float fVar86;
  vint4 bi_2;
  undefined1 auVar60 [16];
  float fVar87;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  float fVar85;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  float fVar88;
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined8 uVar89;
  vint4 bi_1;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined8 extraout_XMM1_Qa;
  undefined1 auVar105 [16];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 extraout_var [56];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  float fVar120;
  vint4 ai_2;
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  float fVar132;
  float fVar143;
  vint4 ai;
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [32];
  vint4 bi;
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [32];
  float fVar157;
  float fVar173;
  float fVar174;
  vint4 ai_1;
  undefined1 auVar158 [16];
  float fVar175;
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [32];
  float fVar188;
  vfloat4 a0_3;
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar180 [16];
  float fVar190;
  float fVar191;
  float fVar192;
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  float fVar189;
  undefined1 auVar187 [32];
  float fVar193;
  float fVar203;
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  float fVar204;
  float fVar221;
  __m128 a;
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  float fVar222;
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [32];
  undefined1 auVar220 [64];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  vfloat4 a0_1;
  undefined1 auVar246 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar245 [16];
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  float fVar254;
  float fVar266;
  float fVar267;
  vfloat4 a0;
  undefined1 auVar255 [16];
  float fVar268;
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [32];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar271 [16];
  undefined1 auVar275 [32];
  undefined1 auVar276 [32];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar283 [32];
  undefined1 local_668 [8];
  float fStack_660;
  float fStack_65c;
  undefined1 local_648 [8];
  undefined8 uStack_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  vfloat_impl<4> p00;
  undefined1 local_578 [32];
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  undefined1 local_538 [16];
  undefined1 (*local_520) [16];
  ulong local_518;
  long local_510;
  undefined1 local_508 [8];
  float fStack_500;
  float fStack_4fc;
  undefined1 auStack_4f8 [16];
  undefined1 local_4e8 [32];
  RTCFilterFunctionNArguments args;
  float local_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  undefined4 local_428;
  undefined4 local_418;
  undefined1 local_3e8 [8];
  float fStack_3e0;
  float fStack_3dc;
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  uint mask_stack [4];
  float local_368;
  float fStack_364;
  float fStack_360;
  float fStack_35c;
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  RTCHitN local_248 [16];
  undefined1 local_238 [16];
  undefined4 local_228;
  undefined4 uStack_224;
  undefined4 uStack_220;
  undefined4 uStack_21c;
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined1 local_1e8 [16];
  uint local_1d8;
  uint uStack_1d4;
  uint uStack_1d0;
  uint uStack_1cc;
  uint uStack_1c8;
  uint uStack_1c4;
  uint uStack_1c0;
  uint uStack_1bc;
  undefined1 local_1b8 [32];
  undefined1 local_198 [32];
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  float fStack_140;
  undefined4 uStack_13c;
  undefined1 local_138 [32];
  undefined1 local_118 [32];
  undefined1 local_f8 [32];
  undefined1 local_d8 [32];
  undefined1 local_b8 [32];
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float fStack_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  BBox1f cv_stack [4];
  undefined1 auVar110 [64];
  undefined1 auVar282 [32];
  
  PVar3 = prim[1];
  uVar48 = (ulong)(byte)PVar3;
  auVar105 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x10);
  auVar105 = vinsertps_avx(auVar105,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar9 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                         ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar9 = vinsertps_avx(auVar9,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  fVar56 = *(float *)(prim + uVar48 * 0x19 + 0x12);
  auVar105 = vsubps_avx(auVar105,*(undefined1 (*) [16])(prim + uVar48 * 0x19 + 6));
  auVar60._0_4_ = fVar56 * auVar105._0_4_;
  auVar60._4_4_ = fVar56 * auVar105._4_4_;
  auVar60._8_4_ = fVar56 * auVar105._8_4_;
  auVar60._12_4_ = fVar56 * auVar105._12_4_;
  auVar144._0_4_ = fVar56 * auVar9._0_4_;
  auVar144._4_4_ = fVar56 * auVar9._4_4_;
  auVar144._8_4_ = fVar56 * auVar9._8_4_;
  auVar144._12_4_ = fVar56 * auVar9._12_4_;
  auVar105 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar48 * 4 + 6)));
  auVar105 = vcvtdq2ps_avx(auVar105);
  auVar9 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar48 * 5 + 6)));
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar12 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar48 * 6 + 6)));
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar13 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar48 * 0xb + 6)));
  auVar13 = vcvtdq2ps_avx(auVar13);
  auVar14 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar48 * 0xc + 6)));
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar15 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar48 * 0xd + 6)));
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar63 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar48 * 0x12 + 6)));
  auVar63 = vcvtdq2ps_avx(auVar63);
  auVar62 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar48 * 0x13 + 6)));
  auVar62 = vcvtdq2ps_avx(auVar62);
  auVar111 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar48 * 0x14 + 6)));
  auVar111 = vcvtdq2ps_avx(auVar111);
  auVar269._4_4_ = auVar144._0_4_;
  auVar269._0_4_ = auVar144._0_4_;
  auVar269._8_4_ = auVar144._0_4_;
  auVar269._12_4_ = auVar144._0_4_;
  auVar91 = vshufps_avx(auVar144,auVar144,0x55);
  auVar61 = vshufps_avx(auVar144,auVar144,0xaa);
  fVar56 = auVar61._0_4_;
  auVar223._0_4_ = fVar56 * auVar12._0_4_;
  fVar84 = auVar61._4_4_;
  auVar223._4_4_ = fVar84 * auVar12._4_4_;
  fVar59 = auVar61._8_4_;
  auVar223._8_4_ = fVar59 * auVar12._8_4_;
  fVar87 = auVar61._12_4_;
  auVar223._12_4_ = fVar87 * auVar12._12_4_;
  auVar205._0_4_ = auVar15._0_4_ * fVar56;
  auVar205._4_4_ = auVar15._4_4_ * fVar84;
  auVar205._8_4_ = auVar15._8_4_ * fVar59;
  auVar205._12_4_ = auVar15._12_4_ * fVar87;
  auVar176._0_4_ = auVar111._0_4_ * fVar56;
  auVar176._4_4_ = auVar111._4_4_ * fVar84;
  auVar176._8_4_ = auVar111._8_4_ * fVar59;
  auVar176._12_4_ = auVar111._12_4_ * fVar87;
  auVar61 = vfmadd231ps_fma(auVar223,auVar91,auVar9);
  auVar92 = vfmadd231ps_fma(auVar205,auVar91,auVar14);
  auVar91 = vfmadd231ps_fma(auVar176,auVar62,auVar91);
  auVar121 = vfmadd231ps_fma(auVar61,auVar269,auVar105);
  auVar92 = vfmadd231ps_fma(auVar92,auVar269,auVar13);
  auVar134 = vfmadd231ps_fma(auVar91,auVar63,auVar269);
  auVar270._4_4_ = auVar60._0_4_;
  auVar270._0_4_ = auVar60._0_4_;
  auVar270._8_4_ = auVar60._0_4_;
  auVar270._12_4_ = auVar60._0_4_;
  auVar91 = vshufps_avx(auVar60,auVar60,0x55);
  auVar61 = vshufps_avx(auVar60,auVar60,0xaa);
  fVar56 = auVar61._0_4_;
  auVar145._0_4_ = fVar56 * auVar12._0_4_;
  fVar84 = auVar61._4_4_;
  auVar145._4_4_ = fVar84 * auVar12._4_4_;
  fVar59 = auVar61._8_4_;
  auVar145._8_4_ = fVar59 * auVar12._8_4_;
  fVar87 = auVar61._12_4_;
  auVar145._12_4_ = fVar87 * auVar12._12_4_;
  auVar90._0_4_ = auVar15._0_4_ * fVar56;
  auVar90._4_4_ = auVar15._4_4_ * fVar84;
  auVar90._8_4_ = auVar15._8_4_ * fVar59;
  auVar90._12_4_ = auVar15._12_4_ * fVar87;
  auVar61._0_4_ = auVar111._0_4_ * fVar56;
  auVar61._4_4_ = auVar111._4_4_ * fVar84;
  auVar61._8_4_ = auVar111._8_4_ * fVar59;
  auVar61._12_4_ = auVar111._12_4_ * fVar87;
  auVar9 = vfmadd231ps_fma(auVar145,auVar91,auVar9);
  auVar12 = vfmadd231ps_fma(auVar90,auVar91,auVar14);
  auVar14 = vfmadd231ps_fma(auVar61,auVar91,auVar62);
  auVar15 = vfmadd231ps_fma(auVar9,auVar270,auVar105);
  auVar62 = vfmadd231ps_fma(auVar12,auVar270,auVar13);
  auVar111 = vfmadd231ps_fma(auVar14,auVar270,auVar63);
  auVar238._8_4_ = 0x7fffffff;
  auVar238._0_8_ = 0x7fffffff7fffffff;
  auVar238._12_4_ = 0x7fffffff;
  auVar105 = vandps_avx(auVar121,auVar238);
  auVar133._8_4_ = 0x219392ef;
  auVar133._0_8_ = 0x219392ef219392ef;
  auVar133._12_4_ = 0x219392ef;
  auVar105 = vcmpps_avx(auVar105,auVar133,1);
  auVar9 = vblendvps_avx(auVar121,auVar133,auVar105);
  auVar105 = vandps_avx(auVar92,auVar238);
  auVar105 = vcmpps_avx(auVar105,auVar133,1);
  auVar12 = vblendvps_avx(auVar92,auVar133,auVar105);
  auVar105 = vandps_avx(auVar238,auVar134);
  auVar105 = vcmpps_avx(auVar105,auVar133,1);
  auVar105 = vblendvps_avx(auVar134,auVar133,auVar105);
  auVar13 = vrcpps_avx(auVar9);
  auVar177._8_4_ = 0x3f800000;
  auVar177._0_8_ = 0x3f8000003f800000;
  auVar177._12_4_ = 0x3f800000;
  auVar9 = vfnmadd213ps_fma(auVar9,auVar13,auVar177);
  auVar13 = vfmadd132ps_fma(auVar9,auVar13,auVar13);
  auVar9 = vrcpps_avx(auVar12);
  auVar12 = vfnmadd213ps_fma(auVar12,auVar9,auVar177);
  auVar14 = vfmadd132ps_fma(auVar12,auVar9,auVar9);
  auVar9 = vrcpps_avx(auVar105);
  auVar105 = vfnmadd213ps_fma(auVar105,auVar9,auVar177);
  auVar63 = vfmadd132ps_fma(auVar105,auVar9,auVar9);
  auVar105._8_8_ = 0;
  auVar105._0_8_ = *(ulong *)(prim + uVar48 * 7 + 6);
  auVar105 = vpmovsxwd_avx(auVar105);
  auVar105 = vcvtdq2ps_avx(auVar105);
  auVar105 = vsubps_avx(auVar105,auVar15);
  auVar134._0_4_ = auVar13._0_4_ * auVar105._0_4_;
  auVar134._4_4_ = auVar13._4_4_ * auVar105._4_4_;
  auVar134._8_4_ = auVar13._8_4_ * auVar105._8_4_;
  auVar134._12_4_ = auVar13._12_4_ * auVar105._12_4_;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar48 * 9 + 6);
  auVar105 = vpmovsxwd_avx(auVar9);
  auVar105 = vcvtdq2ps_avx(auVar105);
  auVar105 = vsubps_avx(auVar105,auVar15);
  auVar146._0_4_ = auVar13._0_4_ * auVar105._0_4_;
  auVar146._4_4_ = auVar13._4_4_ * auVar105._4_4_;
  auVar146._8_4_ = auVar13._8_4_ * auVar105._8_4_;
  auVar146._12_4_ = auVar13._12_4_ * auVar105._12_4_;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar48 * 0xe + 6);
  auVar105 = vpmovsxwd_avx(auVar12);
  auVar105 = vcvtdq2ps_avx(auVar105);
  auVar105 = vsubps_avx(auVar105,auVar62);
  auVar158._0_4_ = auVar14._0_4_ * auVar105._0_4_;
  auVar158._4_4_ = auVar14._4_4_ * auVar105._4_4_;
  auVar158._8_4_ = auVar14._8_4_ * auVar105._8_4_;
  auVar158._12_4_ = auVar14._12_4_ * auVar105._12_4_;
  auVar92._1_3_ = 0;
  auVar92[0] = PVar3;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + 6);
  auVar105 = vpmovsxwd_avx(auVar13);
  auVar105 = vcvtdq2ps_avx(auVar105);
  auVar105 = vsubps_avx(auVar105,auVar62);
  auVar91._0_4_ = auVar14._0_4_ * auVar105._0_4_;
  auVar91._4_4_ = auVar14._4_4_ * auVar105._4_4_;
  auVar91._8_4_ = auVar14._8_4_ * auVar105._8_4_;
  auVar91._12_4_ = auVar14._12_4_ * auVar105._12_4_;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar48 * 0x15 + 6);
  auVar105 = vpmovsxwd_avx(auVar14);
  auVar105 = vcvtdq2ps_avx(auVar105);
  auVar105 = vsubps_avx(auVar105,auVar111);
  auVar121._0_4_ = auVar63._0_4_ * auVar105._0_4_;
  auVar121._4_4_ = auVar63._4_4_ * auVar105._4_4_;
  auVar121._8_4_ = auVar63._8_4_ * auVar105._8_4_;
  auVar121._12_4_ = auVar63._12_4_ * auVar105._12_4_;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar48 * 0x17 + 6);
  auVar105 = vpmovsxwd_avx(auVar15);
  auVar105 = vcvtdq2ps_avx(auVar105);
  auVar105 = vsubps_avx(auVar105,auVar111);
  auVar62._0_4_ = auVar63._0_4_ * auVar105._0_4_;
  auVar62._4_4_ = auVar63._4_4_ * auVar105._4_4_;
  auVar62._8_4_ = auVar63._8_4_ * auVar105._8_4_;
  auVar62._12_4_ = auVar63._12_4_ * auVar105._12_4_;
  auVar105 = vpminsd_avx(auVar134,auVar146);
  auVar9 = vpminsd_avx(auVar158,auVar91);
  auVar105 = vmaxps_avx(auVar105,auVar9);
  auVar9 = vpminsd_avx(auVar121,auVar62);
  uVar54 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar206._4_4_ = uVar54;
  auVar206._0_4_ = uVar54;
  auVar206._8_4_ = uVar54;
  auVar206._12_4_ = uVar54;
  auVar9 = vmaxps_avx(auVar9,auVar206);
  auVar105 = vmaxps_avx(auVar105,auVar9);
  auVar194._0_4_ = auVar105._0_4_ * 0.99999964;
  auVar194._4_4_ = auVar105._4_4_ * 0.99999964;
  auVar194._8_4_ = auVar105._8_4_ * 0.99999964;
  auVar194._12_4_ = auVar105._12_4_ * 0.99999964;
  auVar105 = vpmaxsd_avx(auVar134,auVar146);
  auVar9 = vpmaxsd_avx(auVar158,auVar91);
  auVar105 = vminps_avx(auVar105,auVar9);
  auVar9 = vpmaxsd_avx(auVar121,auVar62);
  uVar54 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar111._4_4_ = uVar54;
  auVar111._0_4_ = uVar54;
  auVar111._8_4_ = uVar54;
  auVar111._12_4_ = uVar54;
  auVar9 = vminps_avx(auVar9,auVar111);
  auVar105 = vminps_avx(auVar105,auVar9);
  auVar63._0_4_ = auVar105._0_4_ * 1.0000004;
  auVar63._4_4_ = auVar105._4_4_ * 1.0000004;
  auVar63._8_4_ = auVar105._8_4_ * 1.0000004;
  auVar63._12_4_ = auVar105._12_4_ * 1.0000004;
  auVar92[4] = PVar3;
  auVar92._5_3_ = 0;
  auVar92[8] = PVar3;
  auVar92._9_3_ = 0;
  auVar92[0xc] = PVar3;
  auVar92._13_3_ = 0;
  auVar9 = vpcmpgtd_avx(auVar92,_DAT_01f4ad30);
  auVar105 = vcmpps_avx(auVar194,auVar63,2);
  auVar105 = vandps_avx(auVar105,auVar9);
  uVar54 = vmovmskps_avx(auVar105);
  uVar48 = CONCAT44((int)((ulong)unaff_RBP >> 0x20),uVar54);
  auVar81._16_16_ = mm_lookupmask_ps._240_16_;
  auVar81._0_16_ = mm_lookupmask_ps._240_16_;
  local_1b8 = vblendps_avx(auVar81,ZEXT832(0) << 0x20,0x80);
  local_520 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
LAB_0115a949:
  if (uVar48 == 0) {
    return;
  }
  lVar50 = 0;
  for (uVar49 = uVar48; (uVar49 & 1) == 0; uVar49 = uVar49 >> 1 | 0x8000000000000000) {
    lVar50 = lVar50 + 1;
  }
  uVar47 = *(uint *)(prim + 2);
  uVar4 = *(uint *)(prim + lVar50 * 4 + 6);
  local_518 = (ulong)uVar4;
  pGVar5 = (context->scene->geometries).items[uVar47].ptr;
  lVar6 = *(long *)&pGVar5[1].time_range.upper;
  uVar49 = (ulong)*(uint *)(*(long *)&pGVar5->field_0x58 +
                           local_518 *
                           pGVar5[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  auVar105 = *(undefined1 (*) [16])(lVar6 + (long)pGVar5[1].intersectionFilterN * uVar49);
  lVar50 = uVar49 + 1;
  auVar9 = *(undefined1 (*) [16])(lVar6 + (long)pGVar5[1].intersectionFilterN * lVar50);
  _Var7 = pGVar5[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar12 = *(undefined1 (*) [16])(_Var7 + (long)pGVar5[2].userPtr * uVar49);
  auVar13 = *(undefined1 (*) [16])(_Var7 + (long)pGVar5[2].userPtr * lVar50);
  auVar14 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x1c);
  auVar14 = vinsertps_avx(auVar14,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  auVar277._8_4_ = 0x3eaaaaab;
  auVar277._0_8_ = 0x3eaaaaab3eaaaaab;
  auVar277._12_4_ = 0x3eaaaaab;
  auVar15 = vfmadd132ps_fma(*(undefined1 (*) [16])
                             (pGVar5[2].intersectionFilterN +
                             (long)pGVar5[2].pointQueryFunc * uVar49),auVar105,auVar277);
  auVar61 = vfnmadd132ps_fma(*(undefined1 (*) [16])
                              (pGVar5[2].intersectionFilterN +
                              (long)pGVar5[2].pointQueryFunc * lVar50),auVar9,auVar277);
  auVar63 = vfmadd132ps_fma(*(undefined1 (*) [16])
                             ((long)pGVar5[3].userPtr +
                             uVar49 * *(long *)&pGVar5[3].fnumTimeSegments),auVar12,auVar277);
  auVar92 = vfnmadd132ps_fma(*(undefined1 (*) [16])
                              ((long)pGVar5[3].userPtr +
                              *(long *)&pGVar5[3].fnumTimeSegments * lVar50),auVar13,auVar277);
  auVar64._12_4_ = 0;
  auVar64._0_12_ = ZEXT812(0);
  auVar64 = auVar64 << 0x20;
  auVar246._0_4_ = auVar9._0_4_ * 0.0;
  auVar246._4_4_ = auVar9._4_4_ * 0.0;
  auVar246._8_4_ = auVar9._8_4_ * 0.0;
  auVar246._12_4_ = auVar9._12_4_ * 0.0;
  auVar111 = vfmadd231ps_fma(auVar246,auVar61,auVar64);
  auVar62 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar15,auVar111);
  local_668._0_4_ = auVar105._0_4_ + auVar62._0_4_;
  local_668._4_4_ = auVar105._4_4_ + auVar62._4_4_;
  fStack_660 = auVar105._8_4_ + auVar62._8_4_;
  fStack_65c = auVar105._12_4_ + auVar62._12_4_;
  auVar271._8_4_ = 0x40400000;
  auVar271._0_8_ = 0x4040000040400000;
  auVar271._12_4_ = 0x40400000;
  auVar62 = vfmadd231ps_fma(auVar111,auVar15,auVar271);
  auVar121 = vfnmadd231ps_fma(auVar62,auVar105,auVar271);
  auVar239._0_4_ = auVar13._0_4_ * 0.0;
  auVar239._4_4_ = auVar13._4_4_ * 0.0;
  auVar239._8_4_ = auVar13._8_4_ * 0.0;
  auVar239._12_4_ = auVar13._12_4_ * 0.0;
  auVar111 = vfmadd231ps_fma(auVar239,auVar92,auVar64);
  auVar62 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar63,auVar111);
  auVar255._0_4_ = auVar12._0_4_ + auVar62._0_4_;
  auVar255._4_4_ = auVar12._4_4_ + auVar62._4_4_;
  auVar255._8_4_ = auVar12._8_4_ + auVar62._8_4_;
  auVar255._12_4_ = auVar12._12_4_ + auVar62._12_4_;
  auVar62 = vfmadd231ps_fma(auVar111,auVar63,auVar271);
  auVar111 = vfnmadd231ps_fma(auVar62,auVar12,auVar271);
  auVar62 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar61,auVar9);
  auVar62 = vfmadd231ps_fma(auVar62,auVar15,auVar64);
  auVar91 = vfmadd231ps_fma(auVar62,auVar105,auVar64);
  auVar135._0_4_ = auVar9._0_4_ * 3.0;
  auVar135._4_4_ = auVar9._4_4_ * 3.0;
  auVar135._8_4_ = auVar9._8_4_ * 3.0;
  auVar135._12_4_ = auVar9._12_4_ * 3.0;
  auVar9 = vfnmadd231ps_fma(auVar135,auVar271,auVar61);
  auVar9 = vfmadd231ps_fma(auVar9,auVar64,auVar15);
  auVar61 = vfnmadd231ps_fma(auVar9,auVar64,auVar105);
  auVar105 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar92,auVar13);
  auVar105 = vfmadd231ps_fma(auVar105,auVar63,auVar64);
  auVar15 = vfmadd231ps_fma(auVar105,auVar12,auVar64);
  auVar178._0_4_ = auVar13._0_4_ * 3.0;
  auVar178._4_4_ = auVar13._4_4_ * 3.0;
  auVar178._8_4_ = auVar13._8_4_ * 3.0;
  auVar178._12_4_ = auVar13._12_4_ * 3.0;
  auVar105 = vfnmadd231ps_fma(auVar178,auVar271,auVar92);
  auVar105 = vfmadd231ps_fma(auVar105,auVar64,auVar63);
  auVar63 = vfnmadd231ps_fma(auVar105,auVar64,auVar12);
  auVar105 = vshufps_avx(auVar121,auVar121,0xc9);
  auVar9 = vshufps_avx(auVar255,auVar255,0xc9);
  fVar56 = auVar121._0_4_;
  auVar195._0_4_ = auVar9._0_4_ * fVar56;
  fVar59 = auVar121._4_4_;
  auVar195._4_4_ = auVar9._4_4_ * fVar59;
  fVar120 = auVar121._8_4_;
  auVar195._8_4_ = auVar9._8_4_ * fVar120;
  fVar86 = auVar121._12_4_;
  auVar195._12_4_ = auVar9._12_4_ * fVar86;
  auVar9 = vfmsub231ps_fma(auVar195,auVar105,auVar255);
  auVar12 = vshufps_avx(auVar9,auVar9,0xc9);
  auVar9 = vshufps_avx(auVar111,auVar111,0xc9);
  auVar207._0_4_ = auVar9._0_4_ * fVar56;
  auVar207._4_4_ = auVar9._4_4_ * fVar59;
  auVar207._8_4_ = auVar9._8_4_ * fVar120;
  auVar207._12_4_ = auVar9._12_4_ * fVar86;
  auVar105 = vfmsub231ps_fma(auVar207,auVar105,auVar111);
  auVar13 = vshufps_avx(auVar105,auVar105,0xc9);
  auVar9 = vshufps_avx(auVar61,auVar61,0xc9);
  auVar105 = vshufps_avx(auVar15,auVar15,0xc9);
  fVar84 = auVar61._0_4_;
  auVar224._0_4_ = auVar105._0_4_ * fVar84;
  fVar87 = auVar61._4_4_;
  auVar224._4_4_ = auVar105._4_4_ * fVar87;
  fVar85 = auVar61._8_4_;
  auVar224._8_4_ = auVar105._8_4_ * fVar85;
  fVar58 = auVar61._12_4_;
  auVar224._12_4_ = auVar105._12_4_ * fVar58;
  auVar105 = vfmsub231ps_fma(auVar224,auVar9,auVar15);
  auVar15 = vshufps_avx(auVar105,auVar105,0xc9);
  auVar105 = vshufps_avx(auVar63,auVar63,0xc9);
  auVar225._0_4_ = auVar105._0_4_ * fVar84;
  auVar225._4_4_ = auVar105._4_4_ * fVar87;
  auVar225._8_4_ = auVar105._8_4_ * fVar85;
  auVar225._12_4_ = auVar105._12_4_ * fVar58;
  auVar105 = vdpps_avx(auVar12,auVar12,0x7f);
  auVar9 = vfmsub231ps_fma(auVar225,auVar9,auVar63);
  auVar63 = vshufps_avx(auVar9,auVar9,0xc9);
  fVar222 = auVar105._0_4_;
  auVar62 = ZEXT416((uint)fVar222);
  auVar9 = vrsqrtss_avx(auVar62,auVar62);
  fVar57 = auVar9._0_4_;
  fVar132 = fVar57 * 1.5 - fVar222 * 0.5 * fVar57 * fVar57 * fVar57;
  fVar157 = auVar12._0_4_ * fVar132;
  fVar173 = auVar12._4_4_ * fVar132;
  fVar174 = auVar12._8_4_ * fVar132;
  fVar175 = auVar12._12_4_ * fVar132;
  auVar9 = vdpps_avx(auVar12,auVar13,0x7f);
  auVar208._0_4_ = fVar222 * auVar13._0_4_;
  auVar208._4_4_ = fVar222 * auVar13._4_4_;
  auVar208._8_4_ = fVar222 * auVar13._8_4_;
  auVar208._12_4_ = fVar222 * auVar13._12_4_;
  fVar57 = auVar9._0_4_;
  auVar196._0_4_ = fVar57 * auVar12._0_4_;
  auVar196._4_4_ = fVar57 * auVar12._4_4_;
  auVar196._8_4_ = fVar57 * auVar12._8_4_;
  auVar196._12_4_ = fVar57 * auVar12._12_4_;
  auVar12 = vsubps_avx(auVar208,auVar196);
  auVar9 = vrcpss_avx(auVar62,auVar62);
  auVar105 = vfnmadd213ss_fma(auVar105,auVar9,SUB6416(ZEXT464(0x40000000),0));
  fVar57 = auVar9._0_4_ * auVar105._0_4_;
  auVar105 = vdpps_avx(auVar15,auVar15,0x7f);
  fVar222 = auVar105._0_4_;
  auVar62 = ZEXT416((uint)fVar222);
  auVar9 = vrsqrtss_avx(auVar62,auVar62);
  fVar143 = auVar9._0_4_;
  fVar143 = fVar143 * 1.5 - fVar222 * 0.5 * fVar143 * fVar143 * fVar143;
  auVar9 = vdpps_avx(auVar15,auVar63,0x7f);
  fVar254 = fVar143 * auVar15._0_4_;
  fVar266 = fVar143 * auVar15._4_4_;
  fVar267 = fVar143 * auVar15._8_4_;
  fVar268 = fVar143 * auVar15._12_4_;
  auVar179._0_4_ = fVar222 * auVar63._0_4_;
  auVar179._4_4_ = fVar222 * auVar63._4_4_;
  auVar179._8_4_ = fVar222 * auVar63._8_4_;
  auVar179._12_4_ = fVar222 * auVar63._12_4_;
  fVar222 = auVar9._0_4_;
  auVar124._0_4_ = fVar222 * auVar15._0_4_;
  auVar124._4_4_ = fVar222 * auVar15._4_4_;
  auVar124._8_4_ = fVar222 * auVar15._8_4_;
  auVar124._12_4_ = fVar222 * auVar15._12_4_;
  auVar13 = vsubps_avx(auVar179,auVar124);
  auVar9 = vrcpss_avx(auVar62,auVar62);
  auVar105 = vfnmadd213ss_fma(auVar105,auVar9,ZEXT416(0x40000000));
  fVar222 = auVar105._0_4_ * auVar9._0_4_;
  auVar105 = vshufps_avx(_local_668,_local_668,0xff);
  auVar209._0_4_ = auVar105._0_4_ * fVar157;
  auVar209._4_4_ = auVar105._4_4_ * fVar173;
  auVar209._8_4_ = auVar105._8_4_ * fVar174;
  auVar209._12_4_ = auVar105._12_4_ * fVar175;
  auVar62 = vsubps_avx(_local_668,auVar209);
  auVar9 = vshufps_avx(auVar121,auVar121,0xff);
  auVar159._0_4_ = auVar9._0_4_ * fVar157 + fVar132 * auVar12._0_4_ * fVar57 * auVar105._0_4_;
  auVar159._4_4_ = auVar9._4_4_ * fVar173 + fVar132 * auVar12._4_4_ * fVar57 * auVar105._4_4_;
  auVar159._8_4_ = auVar9._8_4_ * fVar174 + fVar132 * auVar12._8_4_ * fVar57 * auVar105._8_4_;
  auVar159._12_4_ = auVar9._12_4_ * fVar175 + fVar132 * auVar12._12_4_ * fVar57 * auVar105._12_4_;
  auVar12 = vsubps_avx(auVar121,auVar159);
  auVar226._0_4_ = auVar209._0_4_ + (float)local_668._0_4_;
  auVar226._4_4_ = auVar209._4_4_ + (float)local_668._4_4_;
  auVar226._8_4_ = auVar209._8_4_ + fStack_660;
  auVar226._12_4_ = auVar209._12_4_ + fStack_65c;
  auVar105 = vshufps_avx(auVar91,auVar91,0xff);
  auVar112._0_4_ = fVar254 * auVar105._0_4_;
  auVar112._4_4_ = fVar266 * auVar105._4_4_;
  auVar112._8_4_ = fVar267 * auVar105._8_4_;
  auVar112._12_4_ = fVar268 * auVar105._12_4_;
  auVar111 = vsubps_avx(auVar91,auVar112);
  auVar9 = vshufps_avx(auVar61,auVar61,0xff);
  auVar93._0_4_ = fVar254 * auVar9._0_4_ + auVar105._0_4_ * fVar143 * auVar13._0_4_ * fVar222;
  auVar93._4_4_ = fVar266 * auVar9._4_4_ + auVar105._4_4_ * fVar143 * auVar13._4_4_ * fVar222;
  auVar93._8_4_ = fVar267 * auVar9._8_4_ + auVar105._8_4_ * fVar143 * auVar13._8_4_ * fVar222;
  auVar93._12_4_ = fVar268 * auVar9._12_4_ + auVar105._12_4_ * fVar143 * auVar13._12_4_ * fVar222;
  auVar105 = vsubps_avx(auVar61,auVar93);
  fVar157 = auVar91._0_4_ + auVar112._0_4_;
  fVar173 = auVar91._4_4_ + auVar112._4_4_;
  fVar174 = auVar91._8_4_ + auVar112._8_4_;
  fVar175 = auVar91._12_4_ + auVar112._12_4_;
  auVar122._0_4_ = auVar62._0_4_ + auVar12._0_4_ * 0.33333334;
  auVar122._4_4_ = auVar62._4_4_ + auVar12._4_4_ * 0.33333334;
  auVar122._8_4_ = auVar62._8_4_ + auVar12._8_4_ * 0.33333334;
  auVar122._12_4_ = auVar62._12_4_ + auVar12._12_4_ * 0.33333334;
  auVar94._0_4_ = auVar105._0_4_ * 0.33333334;
  auVar94._4_4_ = auVar105._4_4_ * 0.33333334;
  auVar94._8_4_ = auVar105._8_4_ * 0.33333334;
  auVar94._12_4_ = auVar105._12_4_ * 0.33333334;
  auVar91 = vsubps_avx(auVar111,auVar94);
  auVar61 = vsubps_avx(auVar62,auVar14);
  auVar105 = vshufps_avx(auVar61,auVar61,0x55);
  auVar9 = vshufps_avx(auVar61,auVar61,0xaa);
  aVar2 = pre->ray_space[k].vy.field_0;
  fVar57 = pre->ray_space[k].vz.field_0.m128[0];
  fVar222 = pre->ray_space[k].vz.field_0.m128[1];
  fVar132 = pre->ray_space[k].vz.field_0.m128[2];
  fVar143 = pre->ray_space[k].vz.field_0.m128[3];
  auVar240._0_4_ = fVar57 * auVar9._0_4_;
  auVar240._4_4_ = fVar222 * auVar9._4_4_;
  auVar240._8_4_ = fVar132 * auVar9._8_4_;
  auVar240._12_4_ = fVar143 * auVar9._12_4_;
  auVar12 = vfmadd231ps_fma(auVar240,(undefined1  [16])aVar2,auVar105);
  auVar92 = vsubps_avx(auVar122,auVar14);
  auVar105 = vshufps_avx(auVar92,auVar92,0x55);
  auVar9 = vshufps_avx(auVar92,auVar92,0xaa);
  auVar278._0_4_ = fVar57 * auVar9._0_4_;
  auVar278._4_4_ = fVar222 * auVar9._4_4_;
  auVar278._8_4_ = fVar132 * auVar9._8_4_;
  auVar278._12_4_ = fVar143 * auVar9._12_4_;
  auVar9 = vfmadd231ps_fma(auVar278,(undefined1  [16])aVar2,auVar105);
  auVar121 = vsubps_avx(auVar91,auVar14);
  auVar105 = vshufps_avx(auVar121,auVar121,0xaa);
  auVar244._0_4_ = fVar57 * auVar105._0_4_;
  auVar244._4_4_ = fVar222 * auVar105._4_4_;
  auVar244._8_4_ = fVar132 * auVar105._8_4_;
  auVar244._12_4_ = fVar143 * auVar105._12_4_;
  auVar105 = vshufps_avx(auVar121,auVar121,0x55);
  auVar13 = vfmadd231ps_fma(auVar244,(undefined1  [16])aVar2,auVar105);
  auVar134 = vsubps_avx(auVar111,auVar14);
  auVar105 = vshufps_avx(auVar134,auVar134,0xaa);
  auVar256._0_4_ = fVar57 * auVar105._0_4_;
  auVar256._4_4_ = fVar222 * auVar105._4_4_;
  auVar256._8_4_ = fVar132 * auVar105._8_4_;
  auVar256._12_4_ = fVar143 * auVar105._12_4_;
  auVar105 = vshufps_avx(auVar134,auVar134,0x55);
  auVar15 = vfmadd231ps_fma(auVar256,(undefined1  [16])aVar2,auVar105);
  auVar60 = vsubps_avx(auVar226,auVar14);
  auVar105 = vshufps_avx(auVar60,auVar60,0xaa);
  auVar147._0_4_ = fVar57 * auVar105._0_4_;
  auVar147._4_4_ = fVar222 * auVar105._4_4_;
  auVar147._8_4_ = fVar132 * auVar105._8_4_;
  auVar147._12_4_ = fVar143 * auVar105._12_4_;
  auVar105 = vshufps_avx(auVar60,auVar60,0x55);
  auVar63 = vfmadd231ps_fma(auVar147,(undefined1  [16])aVar2,auVar105);
  auVar65._0_4_ = (fVar56 + auVar159._0_4_) * 0.33333334 + auVar226._0_4_;
  auVar65._4_4_ = (fVar59 + auVar159._4_4_) * 0.33333334 + auVar226._4_4_;
  auVar65._8_4_ = (fVar120 + auVar159._8_4_) * 0.33333334 + auVar226._8_4_;
  auVar65._12_4_ = (fVar86 + auVar159._12_4_) * 0.33333334 + auVar226._12_4_;
  auVar90 = vsubps_avx(auVar65,auVar14);
  auVar105 = vshufps_avx(auVar90,auVar90,0xaa);
  auVar197._0_4_ = auVar105._0_4_ * fVar57;
  auVar197._4_4_ = auVar105._4_4_ * fVar222;
  auVar197._8_4_ = auVar105._8_4_ * fVar132;
  auVar197._12_4_ = auVar105._12_4_ * fVar143;
  auVar105 = vshufps_avx(auVar90,auVar90,0x55);
  auVar146 = vfmadd231ps_fma(auVar197,(undefined1  [16])aVar2,auVar105);
  auVar210._0_4_ = (fVar84 + auVar93._0_4_) * 0.33333334;
  auVar210._4_4_ = (fVar87 + auVar93._4_4_) * 0.33333334;
  auVar210._8_4_ = (fVar85 + auVar93._8_4_) * 0.33333334;
  auVar210._12_4_ = (fVar58 + auVar93._12_4_) * 0.33333334;
  auVar127._4_4_ = fVar173;
  auVar127._0_4_ = fVar157;
  auVar127._8_4_ = fVar174;
  auVar127._12_4_ = fVar175;
  auVar133 = vsubps_avx(auVar127,auVar210);
  auVar144 = vsubps_avx(auVar133,auVar14);
  auVar105 = vshufps_avx(auVar144,auVar144,0xaa);
  auVar211._0_4_ = auVar105._0_4_ * fVar57;
  auVar211._4_4_ = auVar105._4_4_ * fVar222;
  auVar211._8_4_ = auVar105._8_4_ * fVar132;
  auVar211._12_4_ = auVar105._12_4_ * fVar143;
  auVar105 = vshufps_avx(auVar144,auVar144,0x55);
  auVar158 = vfmadd231ps_fma(auVar211,(undefined1  [16])aVar2,auVar105);
  auVar145 = vsubps_avx(auVar127,auVar14);
  auVar105 = vshufps_avx(auVar145,auVar145,0xaa);
  auVar66._0_4_ = fVar57 * auVar105._0_4_;
  auVar66._4_4_ = fVar222 * auVar105._4_4_;
  auVar66._8_4_ = fVar132 * auVar105._8_4_;
  auVar66._12_4_ = fVar143 * auVar105._12_4_;
  auVar105 = vshufps_avx(auVar145,auVar145,0x55);
  auVar105 = vfmadd231ps_fma(auVar66,(undefined1  [16])aVar2,auVar105);
  local_418 = auVar61._0_4_;
  auVar160._4_4_ = local_418;
  auVar160._0_4_ = local_418;
  auVar160._8_4_ = local_418;
  auVar160._12_4_ = local_418;
  aVar2 = pre->ray_space[k].vx.field_0;
  auVar176 = vfmadd231ps_fma(auVar12,(undefined1  [16])aVar2,auVar160);
  local_428 = auVar92._0_4_;
  auVar161._4_4_ = local_428;
  auVar161._0_4_ = local_428;
  auVar161._8_4_ = local_428;
  auVar161._12_4_ = local_428;
  auVar177 = vfmadd231ps_fma(auVar9,(undefined1  [16])aVar2,auVar161);
  uVar54 = auVar121._0_4_;
  auVar162._4_4_ = uVar54;
  auVar162._0_4_ = uVar54;
  auVar162._8_4_ = uVar54;
  auVar162._12_4_ = uVar54;
  auVar205 = vfmadd231ps_fma(auVar13,(undefined1  [16])aVar2,auVar162);
  uVar54 = auVar134._0_4_;
  auVar163._4_4_ = uVar54;
  auVar163._0_4_ = uVar54;
  auVar163._8_4_ = uVar54;
  auVar163._12_4_ = uVar54;
  auVar206 = vfmadd231ps_fma(auVar15,(undefined1  [16])aVar2,auVar163);
  uVar54 = auVar60._0_4_;
  auVar164._4_4_ = uVar54;
  auVar164._0_4_ = uVar54;
  auVar164._8_4_ = uVar54;
  auVar164._12_4_ = uVar54;
  auVar223 = vfmadd231ps_fma(auVar63,(undefined1  [16])aVar2,auVar164);
  uVar54 = auVar90._0_4_;
  auVar165._4_4_ = uVar54;
  auVar165._0_4_ = uVar54;
  auVar165._8_4_ = uVar54;
  auVar165._12_4_ = uVar54;
  auVar269 = vfmadd231ps_fma(auVar146,(undefined1  [16])aVar2,auVar165);
  uVar54 = auVar144._0_4_;
  auVar166._4_4_ = uVar54;
  auVar166._0_4_ = uVar54;
  auVar166._8_4_ = uVar54;
  auVar166._12_4_ = uVar54;
  auVar270 = vfmadd231ps_fma(auVar158,(undefined1  [16])aVar2,auVar166);
  uVar54 = auVar145._0_4_;
  auVar167._4_4_ = uVar54;
  auVar167._0_4_ = uVar54;
  auVar167._8_4_ = uVar54;
  auVar167._12_4_ = uVar54;
  auVar64 = vfmadd231ps_fma(auVar105,(undefined1  [16])aVar2,auVar167);
  auVar13 = vmovlhps_avx(auVar176,auVar223);
  auVar14 = vmovlhps_avx(auVar177,auVar269);
  auVar15 = vmovlhps_avx(auVar205,auVar270);
  auVar63 = vmovlhps_avx(auVar206,auVar64);
  auVar105 = vminps_avx(auVar13,auVar14);
  auVar9 = vminps_avx(auVar15,auVar63);
  auVar12 = vminps_avx(auVar105,auVar9);
  auVar105 = vmaxps_avx(auVar13,auVar14);
  auVar9 = vmaxps_avx(auVar15,auVar63);
  auVar105 = vmaxps_avx(auVar105,auVar9);
  auVar9 = vshufpd_avx(auVar12,auVar12,3);
  auVar12 = vminps_avx(auVar12,auVar9);
  auVar9 = vshufpd_avx(auVar105,auVar105,3);
  auVar9 = vmaxps_avx(auVar105,auVar9);
  auVar105 = vandps_avx(auVar238,auVar12);
  auVar9 = vandps_avx(auVar238,auVar9);
  auVar105 = vmaxps_avx(auVar105,auVar9);
  auVar9 = vmovshdup_avx(auVar105);
  auVar105 = vmaxss_avx(auVar9,auVar105);
  local_510 = uVar48 + 0xf;
  fVar84 = auVar105._0_4_ * 9.536743e-07;
  auVar180._8_8_ = auVar176._0_8_;
  auVar180._0_8_ = auVar176._0_8_;
  auVar227._8_8_ = auVar177._0_8_;
  auVar227._0_8_ = auVar177._0_8_;
  auVar245._0_8_ = auVar205._0_8_;
  auVar245._8_8_ = auVar245._0_8_;
  auVar257._0_8_ = auVar206._0_8_;
  auVar257._8_8_ = auVar257._0_8_;
  local_78 = fVar84;
  fStack_74 = fVar84;
  fStack_70 = fVar84;
  fStack_6c = fVar84;
  fStack_68 = fVar84;
  fStack_64 = fVar84;
  fStack_60 = fVar84;
  fStack_5c = fVar84;
  fStack_90 = -fVar84;
  local_98 = -fVar84;
  fStack_94 = -fVar84;
  fStack_8c = fStack_90;
  fStack_88 = fStack_90;
  fStack_84 = fStack_90;
  fStack_80 = fStack_90;
  fStack_7c = fStack_90;
  uVar55 = 0;
  fVar56 = *(float *)(ray + k * 4 + 0x30);
  auVar9 = vsubps_avx(auVar14,auVar13);
  auVar12 = vsubps_avx(auVar15,auVar14);
  auVar146 = vsubps_avx(auVar63,auVar15);
  auVar158 = vsubps_avx(auVar226,auVar62);
  auVar176 = vsubps_avx(auVar65,auVar122);
  auVar177 = vsubps_avx(auVar133,auVar91);
  auVar11._4_4_ = fVar173;
  auVar11._0_4_ = fVar157;
  auVar11._8_4_ = fVar174;
  auVar11._12_4_ = fVar175;
  auVar205 = vsubps_avx(auVar11,auVar111);
  auVar67 = ZEXT816(0x3f80000000000000);
  auVar105 = auVar67;
LAB_0115b0bc:
  auVar206 = vshufps_avx(auVar67,auVar67,0x50);
  auVar279._8_4_ = 0x3f800000;
  auVar279._0_8_ = 0x3f8000003f800000;
  auVar279._12_4_ = 0x3f800000;
  auVar282._16_4_ = 0x3f800000;
  auVar282._0_16_ = auVar279;
  auVar282._20_4_ = 0x3f800000;
  auVar282._24_4_ = 0x3f800000;
  auVar282._28_4_ = 0x3f800000;
  auVar127 = vsubps_avx(auVar279,auVar206);
  fVar59 = auVar206._0_4_;
  fVar132 = auVar223._0_4_;
  auVar68._0_4_ = fVar132 * fVar59;
  fVar87 = auVar206._4_4_;
  fVar143 = auVar223._4_4_;
  auVar68._4_4_ = fVar143 * fVar87;
  fVar120 = auVar206._8_4_;
  auVar68._8_4_ = fVar132 * fVar120;
  fVar85 = auVar206._12_4_;
  auVar68._12_4_ = fVar143 * fVar85;
  fVar254 = auVar269._0_4_;
  auVar168._0_4_ = fVar254 * fVar59;
  fVar266 = auVar269._4_4_;
  auVar168._4_4_ = fVar266 * fVar87;
  auVar168._8_4_ = fVar254 * fVar120;
  auVar168._12_4_ = fVar266 * fVar85;
  fVar193 = auVar270._0_4_;
  auVar136._0_4_ = fVar193 * fVar59;
  fVar203 = auVar270._4_4_;
  auVar136._4_4_ = fVar203 * fVar87;
  auVar136._8_4_ = fVar193 * fVar120;
  auVar136._12_4_ = fVar203 * fVar85;
  fVar204 = auVar64._0_4_;
  auVar113._0_4_ = fVar204 * fVar59;
  fVar221 = auVar64._4_4_;
  auVar113._4_4_ = fVar221 * fVar87;
  auVar113._8_4_ = fVar204 * fVar120;
  auVar113._12_4_ = fVar221 * fVar85;
  auVar246 = vfmadd231ps_fma(auVar68,auVar127,auVar180);
  auVar93 = vfmadd231ps_fma(auVar168,auVar127,auVar227);
  auVar94 = vfmadd231ps_fma(auVar136,auVar127,auVar245);
  auVar240 = vfmadd231ps_fma(auVar113,auVar257,auVar127);
  auVar206 = vmovshdup_avx(auVar105);
  fVar59 = auVar105._0_4_;
  fStack_140 = (auVar206._0_4_ - fVar59) * 0.04761905;
  auVar219._4_4_ = fVar59;
  auVar219._0_4_ = fVar59;
  auVar219._8_4_ = fVar59;
  auVar219._12_4_ = fVar59;
  auVar219._16_4_ = fVar59;
  auVar219._20_4_ = fVar59;
  auVar219._24_4_ = fVar59;
  auVar219._28_4_ = fVar59;
  auVar106._0_8_ = auVar206._0_8_;
  auVar106._8_8_ = auVar106._0_8_;
  auVar106._16_8_ = auVar106._0_8_;
  auVar106._24_8_ = auVar106._0_8_;
  auVar81 = vsubps_avx(auVar106,auVar219);
  uVar54 = auVar246._0_4_;
  auVar275._4_4_ = uVar54;
  auVar275._0_4_ = uVar54;
  auVar275._8_4_ = uVar54;
  auVar275._12_4_ = uVar54;
  auVar275._16_4_ = uVar54;
  auVar275._20_4_ = uVar54;
  auVar275._24_4_ = uVar54;
  auVar275._28_4_ = uVar54;
  auVar206 = vmovshdup_avx(auVar246);
  uVar89 = auVar206._0_8_;
  auVar265._8_8_ = uVar89;
  auVar265._0_8_ = uVar89;
  auVar265._16_8_ = uVar89;
  auVar265._24_8_ = uVar89;
  fVar267 = auVar93._0_4_;
  auVar251._4_4_ = fVar267;
  auVar251._0_4_ = fVar267;
  auVar251._8_4_ = fVar267;
  auVar251._12_4_ = fVar267;
  auVar251._16_4_ = fVar267;
  auVar251._20_4_ = fVar267;
  auVar251._24_4_ = fVar267;
  auVar251._28_4_ = fVar267;
  auVar127 = vmovshdup_avx(auVar93);
  auVar107._0_8_ = auVar127._0_8_;
  auVar107._8_8_ = auVar107._0_8_;
  auVar107._16_8_ = auVar107._0_8_;
  auVar107._24_8_ = auVar107._0_8_;
  fVar222 = auVar94._0_4_;
  auVar185._4_4_ = fVar222;
  auVar185._0_4_ = fVar222;
  auVar185._8_4_ = fVar222;
  auVar185._12_4_ = fVar222;
  auVar185._16_4_ = fVar222;
  auVar185._20_4_ = fVar222;
  auVar185._24_4_ = fVar222;
  auVar185._28_4_ = fVar222;
  auVar11 = vmovshdup_avx(auVar94);
  auVar201._0_8_ = auVar11._0_8_;
  auVar201._8_8_ = auVar201._0_8_;
  auVar201._16_8_ = auVar201._0_8_;
  auVar201._24_8_ = auVar201._0_8_;
  fVar57 = auVar240._0_4_;
  auVar66 = vmovshdup_avx(auVar240);
  auVar112 = vfmadd132ps_fma(auVar81,auVar219,_DAT_01f7b040);
  auVar81 = vsubps_avx(auVar282,ZEXT1632(auVar112));
  fVar59 = auVar112._0_4_;
  fVar87 = auVar112._4_4_;
  auVar16._4_4_ = fVar267 * fVar87;
  auVar16._0_4_ = fVar267 * fVar59;
  fVar120 = auVar112._8_4_;
  auVar16._8_4_ = fVar267 * fVar120;
  fVar85 = auVar112._12_4_;
  auVar16._12_4_ = fVar267 * fVar85;
  auVar16._16_4_ = fVar267 * 0.0;
  auVar16._20_4_ = fVar267 * 0.0;
  auVar16._24_4_ = fVar267 * 0.0;
  auVar16._28_4_ = 0x3f800000;
  auVar112 = vfmadd231ps_fma(auVar16,auVar81,auVar275);
  fVar86 = auVar127._0_4_;
  fVar58 = auVar127._4_4_;
  auVar17._4_4_ = fVar58 * fVar87;
  auVar17._0_4_ = fVar86 * fVar59;
  auVar17._8_4_ = fVar86 * fVar120;
  auVar17._12_4_ = fVar58 * fVar85;
  auVar17._16_4_ = fVar86 * 0.0;
  auVar17._20_4_ = fVar58 * 0.0;
  auVar17._24_4_ = fVar86 * 0.0;
  auVar17._28_4_ = uVar54;
  auVar135 = vfmadd231ps_fma(auVar17,auVar81,auVar265);
  auVar18._4_4_ = fVar222 * fVar87;
  auVar18._0_4_ = fVar222 * fVar59;
  auVar18._8_4_ = fVar222 * fVar120;
  auVar18._12_4_ = fVar222 * fVar85;
  auVar18._16_4_ = fVar222 * 0.0;
  auVar18._20_4_ = fVar222 * 0.0;
  auVar18._24_4_ = fVar222 * 0.0;
  auVar18._28_4_ = auVar206._4_4_;
  auVar124 = vfmadd231ps_fma(auVar18,auVar81,auVar251);
  fVar86 = auVar11._0_4_;
  fVar58 = auVar11._4_4_;
  auVar10._4_4_ = fVar58 * fVar87;
  auVar10._0_4_ = fVar86 * fVar59;
  auVar10._8_4_ = fVar86 * fVar120;
  auVar10._12_4_ = fVar58 * fVar85;
  auVar10._16_4_ = fVar86 * 0.0;
  auVar10._20_4_ = fVar58 * 0.0;
  auVar10._24_4_ = fVar86 * 0.0;
  auVar10._28_4_ = fVar267;
  auVar147 = vfmadd231ps_fma(auVar10,auVar81,auVar107);
  auVar206 = vshufps_avx(auVar246,auVar246,0xaa);
  local_578._8_8_ = auVar206._0_8_;
  local_578._0_8_ = local_578._8_8_;
  local_578._16_8_ = local_578._8_8_;
  local_578._24_8_ = local_578._8_8_;
  auVar127 = vshufps_avx(auVar246,auVar246,0xff);
  uStack_640 = auVar127._0_8_;
  local_648 = (undefined1  [8])uStack_640;
  uStack_638 = uStack_640;
  uStack_630 = uStack_640;
  auVar19._4_4_ = fVar57 * fVar87;
  auVar19._0_4_ = fVar57 * fVar59;
  auVar19._8_4_ = fVar57 * fVar120;
  auVar19._12_4_ = fVar57 * fVar85;
  auVar19._16_4_ = fVar57 * 0.0;
  auVar19._20_4_ = fVar57 * 0.0;
  auVar19._24_4_ = fVar57 * 0.0;
  auVar19._28_4_ = fVar57;
  auVar246 = vfmadd231ps_fma(auVar19,auVar81,auVar185);
  auVar127 = vshufps_avx(auVar93,auVar93,0xaa);
  auVar186._0_8_ = auVar127._0_8_;
  auVar186._8_8_ = auVar186._0_8_;
  auVar186._16_8_ = auVar186._0_8_;
  auVar186._24_8_ = auVar186._0_8_;
  auVar11 = vshufps_avx(auVar93,auVar93,0xff);
  local_4e8._8_8_ = auVar11._0_8_;
  local_4e8._0_8_ = local_4e8._8_8_;
  local_4e8._16_8_ = local_4e8._8_8_;
  local_4e8._24_8_ = local_4e8._8_8_;
  fVar86 = auVar66._0_4_;
  fVar58 = auVar66._4_4_;
  auVar20._4_4_ = fVar58 * fVar87;
  auVar20._0_4_ = fVar86 * fVar59;
  auVar20._8_4_ = fVar86 * fVar120;
  auVar20._12_4_ = fVar58 * fVar85;
  auVar20._16_4_ = fVar86 * 0.0;
  auVar20._20_4_ = fVar58 * 0.0;
  auVar20._24_4_ = fVar86 * 0.0;
  auVar20._28_4_ = auVar206._4_4_;
  auVar159 = vfmadd231ps_fma(auVar20,auVar81,auVar201);
  auVar21._28_4_ = fVar58;
  auVar21._0_28_ =
       ZEXT1628(CONCAT412(auVar124._12_4_ * fVar85,
                          CONCAT48(auVar124._8_4_ * fVar120,
                                   CONCAT44(auVar124._4_4_ * fVar87,auVar124._0_4_ * fVar59))));
  auVar112 = vfmadd231ps_fma(auVar21,auVar81,ZEXT1632(auVar112));
  fVar86 = auVar11._4_4_;
  auVar253._28_4_ = fVar86;
  auVar253._0_28_ =
       ZEXT1628(CONCAT412(auVar147._12_4_ * fVar85,
                          CONCAT48(auVar147._8_4_ * fVar120,
                                   CONCAT44(auVar147._4_4_ * fVar87,auVar147._0_4_ * fVar59))));
  auVar135 = vfmadd231ps_fma(auVar253,auVar81,ZEXT1632(auVar135));
  auVar206 = vshufps_avx(auVar94,auVar94,0xaa);
  uVar89 = auVar206._0_8_;
  auVar172._8_8_ = uVar89;
  auVar172._0_8_ = uVar89;
  auVar172._16_8_ = uVar89;
  auVar172._24_8_ = uVar89;
  auVar66 = vshufps_avx(auVar94,auVar94,0xff);
  uVar89 = auVar66._0_8_;
  auVar283._8_8_ = uVar89;
  auVar283._0_8_ = uVar89;
  auVar283._16_8_ = uVar89;
  auVar283._24_8_ = uVar89;
  auVar94 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar246._12_4_ * fVar85,
                                               CONCAT48(auVar246._8_4_ * fVar120,
                                                        CONCAT44(auVar246._4_4_ * fVar87,
                                                                 auVar246._0_4_ * fVar59)))),auVar81
                            ,ZEXT1632(auVar124));
  auVar246 = vshufps_avx(auVar240,auVar240,0xaa);
  auVar93 = vshufps_avx(auVar240,auVar240,0xff);
  auVar240 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar85 * auVar159._12_4_,
                                                CONCAT48(fVar120 * auVar159._8_4_,
                                                         CONCAT44(fVar87 * auVar159._4_4_,
                                                                  fVar59 * auVar159._0_4_)))),
                             auVar81,ZEXT1632(auVar147));
  auVar124 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar85 * auVar94._12_4_,
                                                CONCAT48(fVar120 * auVar94._8_4_,
                                                         CONCAT44(fVar87 * auVar94._4_4_,
                                                                  fVar59 * auVar94._0_4_)))),auVar81
                             ,ZEXT1632(auVar112));
  auVar16 = vsubps_avx(ZEXT1632(auVar94),ZEXT1632(auVar112));
  auVar94 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar85 * auVar240._12_4_,
                                               CONCAT48(fVar120 * auVar240._8_4_,
                                                        CONCAT44(fVar87 * auVar240._4_4_,
                                                                 fVar59 * auVar240._0_4_)))),auVar81
                            ,ZEXT1632(auVar135));
  auVar17 = vsubps_avx(ZEXT1632(auVar240),ZEXT1632(auVar135));
  fStack_3cc = auVar17._28_4_;
  auVar252._0_4_ = fStack_140 * auVar16._0_4_ * 3.0;
  auVar252._4_4_ = fStack_140 * auVar16._4_4_ * 3.0;
  auVar252._8_4_ = fStack_140 * auVar16._8_4_ * 3.0;
  auVar252._12_4_ = fStack_140 * auVar16._12_4_ * 3.0;
  auVar252._16_4_ = fStack_140 * auVar16._16_4_ * 3.0;
  auVar252._20_4_ = fStack_140 * auVar16._20_4_ * 3.0;
  auVar252._24_4_ = fStack_140 * auVar16._24_4_ * 3.0;
  auVar252._28_4_ = 0;
  local_3e8._0_4_ = fStack_140 * auVar17._0_4_ * 3.0;
  local_3e8._4_4_ = fStack_140 * auVar17._4_4_ * 3.0;
  fStack_3e0 = fStack_140 * auVar17._8_4_ * 3.0;
  fStack_3dc = fStack_140 * auVar17._12_4_ * 3.0;
  fStack_3d8 = fStack_140 * auVar17._16_4_ * 3.0;
  fStack_3d4 = fStack_140 * auVar17._20_4_ * 3.0;
  fStack_3d0 = fStack_140 * auVar17._24_4_ * 3.0;
  fVar58 = auVar127._0_4_;
  fVar57 = auVar127._4_4_;
  auVar23._4_4_ = fVar57 * fVar87;
  auVar23._0_4_ = fVar58 * fVar59;
  auVar23._8_4_ = fVar58 * fVar120;
  auVar23._12_4_ = fVar57 * fVar85;
  auVar23._16_4_ = fVar58 * 0.0;
  auVar23._20_4_ = fVar57 * 0.0;
  auVar23._24_4_ = fVar58 * 0.0;
  auVar23._28_4_ = fStack_3cc;
  auVar127 = vfmadd231ps_fma(auVar23,auVar81,local_578);
  fVar58 = auVar11._0_4_;
  auVar24._4_4_ = fVar86 * fVar87;
  auVar24._0_4_ = fVar58 * fVar59;
  auVar24._8_4_ = fVar58 * fVar120;
  auVar24._12_4_ = fVar86 * fVar85;
  auVar24._16_4_ = fVar58 * 0.0;
  auVar24._20_4_ = fVar86 * 0.0;
  auVar24._24_4_ = fVar58 * 0.0;
  auVar24._28_4_ = 0;
  auVar11 = vfmadd231ps_fma(auVar24,auVar81,_local_648);
  fVar86 = auVar206._0_4_;
  fVar58 = auVar206._4_4_;
  auVar25._4_4_ = fVar58 * fVar87;
  auVar25._0_4_ = fVar86 * fVar59;
  auVar25._8_4_ = fVar86 * fVar120;
  auVar25._12_4_ = fVar58 * fVar85;
  auVar25._16_4_ = fVar86 * 0.0;
  auVar25._20_4_ = fVar58 * 0.0;
  auVar25._24_4_ = fVar86 * 0.0;
  auVar25._28_4_ = auVar16._28_4_;
  auVar206 = vfmadd231ps_fma(auVar25,auVar81,auVar186);
  fVar86 = auVar66._0_4_;
  fVar222 = auVar66._4_4_;
  auVar26._4_4_ = fVar222 * fVar87;
  auVar26._0_4_ = fVar86 * fVar59;
  auVar26._8_4_ = fVar86 * fVar120;
  auVar26._12_4_ = fVar222 * fVar85;
  auVar26._16_4_ = fVar86 * 0.0;
  auVar26._20_4_ = fVar222 * 0.0;
  auVar26._24_4_ = fVar86 * 0.0;
  auVar26._28_4_ = fVar57;
  auVar66 = vfmadd231ps_fma(auVar26,auVar81,local_4e8);
  local_4e8 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar124));
  fVar86 = auVar246._0_4_;
  fVar58 = auVar246._4_4_;
  auVar27._4_4_ = fVar58 * fVar87;
  auVar27._0_4_ = fVar86 * fVar59;
  auVar27._8_4_ = fVar86 * fVar120;
  auVar27._12_4_ = fVar58 * fVar85;
  auVar27._16_4_ = fVar86 * 0.0;
  auVar27._20_4_ = fVar58 * 0.0;
  auVar27._24_4_ = fVar86 * 0.0;
  auVar27._28_4_ = fVar58;
  auVar246 = vfmadd231ps_fma(auVar27,auVar81,auVar172);
  auVar19 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar94));
  fVar86 = auVar93._0_4_;
  fVar58 = auVar93._4_4_;
  auVar28._4_4_ = fVar58 * fVar87;
  auVar28._0_4_ = fVar86 * fVar59;
  auVar28._8_4_ = fVar86 * fVar120;
  auVar28._12_4_ = fVar58 * fVar85;
  auVar28._16_4_ = fVar86 * 0.0;
  auVar28._20_4_ = fVar58 * 0.0;
  auVar28._24_4_ = fVar86 * 0.0;
  auVar28._28_4_ = fVar58;
  auVar93 = vfmadd231ps_fma(auVar28,auVar81,auVar283);
  auVar29._28_4_ = fVar222;
  auVar29._0_28_ =
       ZEXT1628(CONCAT412(auVar206._12_4_ * fVar85,
                          CONCAT48(auVar206._8_4_ * fVar120,
                                   CONCAT44(auVar206._4_4_ * fVar87,auVar206._0_4_ * fVar59))));
  auVar127 = vfmadd231ps_fma(auVar29,auVar81,ZEXT1632(auVar127));
  auVar11 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar85 * auVar66._12_4_,
                                               CONCAT48(fVar120 * auVar66._8_4_,
                                                        CONCAT44(fVar87 * auVar66._4_4_,
                                                                 fVar59 * auVar66._0_4_)))),auVar81,
                            ZEXT1632(auVar11));
  auVar108._0_4_ = auVar124._0_4_ + auVar252._0_4_;
  auVar108._4_4_ = auVar124._4_4_ + auVar252._4_4_;
  auVar108._8_4_ = auVar124._8_4_ + auVar252._8_4_;
  auVar108._12_4_ = auVar124._12_4_ + auVar252._12_4_;
  auVar108._16_4_ = auVar252._16_4_ + 0.0;
  auVar108._20_4_ = auVar252._20_4_ + 0.0;
  auVar108._24_4_ = auVar252._24_4_ + 0.0;
  auVar108._28_4_ = 0;
  auVar206 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar246._12_4_ * fVar85,
                                                CONCAT48(auVar246._8_4_ * fVar120,
                                                         CONCAT44(auVar246._4_4_ * fVar87,
                                                                  auVar246._0_4_ * fVar59)))),
                             auVar81,ZEXT1632(auVar206));
  auVar66 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar93._12_4_ * fVar85,
                                               CONCAT48(auVar93._8_4_ * fVar120,
                                                        CONCAT44(auVar93._4_4_ * fVar87,
                                                                 auVar93._0_4_ * fVar59)))),auVar81,
                            ZEXT1632(auVar66));
  auVar246 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar85 * auVar206._12_4_,
                                                CONCAT48(fVar120 * auVar206._8_4_,
                                                         CONCAT44(fVar87 * auVar206._4_4_,
                                                                  fVar59 * auVar206._0_4_)))),
                             auVar81,ZEXT1632(auVar127));
  auVar93 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar66._12_4_ * fVar85,
                                               CONCAT48(auVar66._8_4_ * fVar120,
                                                        CONCAT44(auVar66._4_4_ * fVar87,
                                                                 auVar66._0_4_ * fVar59)))),
                            ZEXT1632(auVar11),auVar81);
  auVar81 = vsubps_avx(ZEXT1632(auVar206),ZEXT1632(auVar127));
  auVar16 = vsubps_avx(ZEXT1632(auVar66),ZEXT1632(auVar11));
  auVar276._0_4_ = fStack_140 * auVar81._0_4_ * 3.0;
  auVar276._4_4_ = fStack_140 * auVar81._4_4_ * 3.0;
  auVar276._8_4_ = fStack_140 * auVar81._8_4_ * 3.0;
  auVar276._12_4_ = fStack_140 * auVar81._12_4_ * 3.0;
  auVar276._16_4_ = fStack_140 * auVar81._16_4_ * 3.0;
  auVar276._20_4_ = fStack_140 * auVar81._20_4_ * 3.0;
  auVar276._24_4_ = fStack_140 * auVar81._24_4_ * 3.0;
  auVar276._28_4_ = 0;
  local_158 = fStack_140 * auVar16._0_4_ * 3.0;
  fStack_154 = fStack_140 * auVar16._4_4_ * 3.0;
  auVar30._4_4_ = fStack_154;
  auVar30._0_4_ = local_158;
  fStack_150 = fStack_140 * auVar16._8_4_ * 3.0;
  auVar30._8_4_ = fStack_150;
  fStack_14c = fStack_140 * auVar16._12_4_ * 3.0;
  auVar30._12_4_ = fStack_14c;
  fStack_148 = fStack_140 * auVar16._16_4_ * 3.0;
  auVar30._16_4_ = fStack_148;
  fStack_144 = fStack_140 * auVar16._20_4_ * 3.0;
  auVar30._20_4_ = fStack_144;
  fStack_140 = fStack_140 * auVar16._24_4_ * 3.0;
  auVar30._24_4_ = fStack_140;
  auVar30._28_4_ = 0x40400000;
  _local_508 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar246));
  auVar20 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar93));
  auVar81 = vsubps_avx(ZEXT1632(auVar246),ZEXT1632(auVar124));
  auVar16 = vsubps_avx(ZEXT1632(auVar93),ZEXT1632(auVar94));
  auVar17 = vsubps_avx(_local_508,local_4e8);
  fVar267 = auVar81._0_4_ + auVar17._0_4_;
  fVar268 = auVar81._4_4_ + auVar17._4_4_;
  fVar188 = auVar81._8_4_ + auVar17._8_4_;
  fVar189 = auVar81._12_4_ + auVar17._12_4_;
  fVar190 = auVar81._16_4_ + auVar17._16_4_;
  fVar191 = auVar81._20_4_ + auVar17._20_4_;
  fVar192 = auVar81._24_4_ + auVar17._24_4_;
  auVar18 = vsubps_avx(auVar20,auVar19);
  auVar82._0_4_ = auVar16._0_4_ + auVar18._0_4_;
  auVar82._4_4_ = auVar16._4_4_ + auVar18._4_4_;
  auVar82._8_4_ = auVar16._8_4_ + auVar18._8_4_;
  auVar82._12_4_ = auVar16._12_4_ + auVar18._12_4_;
  auVar82._16_4_ = auVar16._16_4_ + auVar18._16_4_;
  auVar82._20_4_ = auVar16._20_4_ + auVar18._20_4_;
  auVar82._24_4_ = auVar16._24_4_ + auVar18._24_4_;
  auVar82._28_4_ = auVar16._28_4_ + auVar18._28_4_;
  local_f8 = ZEXT1632(auVar94);
  fVar59 = auVar94._0_4_;
  local_178 = (float)local_3e8._0_4_ + fVar59;
  fVar87 = auVar94._4_4_;
  fStack_174 = (float)local_3e8._4_4_ + fVar87;
  fVar120 = auVar94._8_4_;
  fStack_170 = fStack_3e0 + fVar120;
  fVar85 = auVar94._12_4_;
  fStack_16c = fStack_3dc + fVar85;
  fStack_168 = fStack_3d8 + 0.0;
  fStack_164 = fStack_3d4 + 0.0;
  fStack_160 = fStack_3d0 + 0.0;
  local_b8 = ZEXT1632(auVar124);
  auVar16 = vsubps_avx(local_b8,auVar252);
  local_d8 = vpermps_avx2(_DAT_01fb7720,auVar16);
  auVar16 = vsubps_avx(local_f8,_local_3e8);
  local_198 = vpermps_avx2(_DAT_01fb7720,auVar16);
  local_118._0_4_ = auVar246._0_4_ + auVar276._0_4_;
  local_118._4_4_ = auVar246._4_4_ + auVar276._4_4_;
  local_118._8_4_ = auVar246._8_4_ + auVar276._8_4_;
  local_118._12_4_ = auVar246._12_4_ + auVar276._12_4_;
  local_118._16_4_ = auVar276._16_4_ + 0.0;
  local_118._20_4_ = auVar276._20_4_ + 0.0;
  local_118._24_4_ = auVar276._24_4_ + 0.0;
  local_118._28_4_ = 0;
  auVar253 = ZEXT1632(auVar246);
  auVar16 = vsubps_avx(auVar253,auVar276);
  auVar21 = vpermps_avx2(_DAT_01fb7720,auVar16);
  fVar86 = auVar93._0_4_;
  local_158 = fVar86 + local_158;
  fVar58 = auVar93._4_4_;
  fStack_154 = fVar58 + fStack_154;
  fVar57 = auVar93._8_4_;
  fStack_150 = fVar57 + fStack_150;
  fVar222 = auVar93._12_4_;
  fStack_14c = fVar222 + fStack_14c;
  fStack_148 = fStack_148 + 0.0;
  fStack_144 = fStack_144 + 0.0;
  fStack_140 = fStack_140 + 0.0;
  auVar16 = vsubps_avx(ZEXT1632(auVar93),auVar30);
  local_138 = vpermps_avx2(_DAT_01fb7720,auVar16);
  auVar31._4_4_ = fVar87 * fVar268;
  auVar31._0_4_ = fVar59 * fVar267;
  auVar31._8_4_ = fVar120 * fVar188;
  auVar31._12_4_ = fVar85 * fVar189;
  auVar31._16_4_ = fVar190 * 0.0;
  auVar31._20_4_ = fVar191 * 0.0;
  auVar31._24_4_ = fVar192 * 0.0;
  auVar31._28_4_ = auVar16._28_4_;
  auVar206 = vfnmadd231ps_fma(auVar31,local_b8,auVar82);
  fStack_15c = fStack_3cc + 0.0;
  auVar32._4_4_ = fStack_174 * fVar268;
  auVar32._0_4_ = local_178 * fVar267;
  auVar32._8_4_ = fStack_170 * fVar188;
  auVar32._12_4_ = fStack_16c * fVar189;
  auVar32._16_4_ = fStack_168 * fVar190;
  auVar32._20_4_ = fStack_164 * fVar191;
  auVar32._24_4_ = fStack_160 * fVar192;
  auVar32._28_4_ = 0;
  auVar127 = vfnmadd231ps_fma(auVar32,auVar82,auVar108);
  auVar33._4_4_ = local_198._4_4_ * fVar268;
  auVar33._0_4_ = local_198._0_4_ * fVar267;
  auVar33._8_4_ = local_198._8_4_ * fVar188;
  auVar33._12_4_ = local_198._12_4_ * fVar189;
  auVar33._16_4_ = local_198._16_4_ * fVar190;
  auVar33._20_4_ = local_198._20_4_ * fVar191;
  auVar33._24_4_ = local_198._24_4_ * fVar192;
  auVar33._28_4_ = fStack_3cc + 0.0;
  auVar11 = vfnmadd231ps_fma(auVar33,local_d8,auVar82);
  local_648._0_4_ = auVar19._0_4_;
  local_648._4_4_ = auVar19._4_4_;
  uStack_640._0_4_ = auVar19._8_4_;
  uStack_640._4_4_ = auVar19._12_4_;
  uStack_638._0_4_ = auVar19._16_4_;
  uStack_638._4_4_ = auVar19._20_4_;
  uStack_630._0_4_ = auVar19._24_4_;
  uStack_630._4_4_ = auVar19._28_4_;
  auVar34._4_4_ = (float)local_648._4_4_ * fVar268;
  auVar34._0_4_ = (float)local_648._0_4_ * fVar267;
  auVar34._8_4_ = (float)uStack_640 * fVar188;
  auVar34._12_4_ = uStack_640._4_4_ * fVar189;
  auVar34._16_4_ = (float)uStack_638 * fVar190;
  auVar34._20_4_ = uStack_638._4_4_ * fVar191;
  auVar34._24_4_ = (float)uStack_630 * fVar192;
  auVar34._28_4_ = uStack_630._4_4_;
  auVar66 = vfnmadd231ps_fma(auVar34,local_4e8,auVar82);
  auVar202._0_4_ = fVar86 * fVar267;
  auVar202._4_4_ = fVar58 * fVar268;
  auVar202._8_4_ = fVar57 * fVar188;
  auVar202._12_4_ = fVar222 * fVar189;
  auVar202._16_4_ = fVar190 * 0.0;
  auVar202._20_4_ = fVar191 * 0.0;
  auVar202._24_4_ = fVar192 * 0.0;
  auVar202._28_4_ = 0;
  auVar246 = vfnmadd231ps_fma(auVar202,auVar253,auVar82);
  uStack_13c = 0x40400000;
  auVar35._4_4_ = fStack_154 * fVar268;
  auVar35._0_4_ = local_158 * fVar267;
  auVar35._8_4_ = fStack_150 * fVar188;
  auVar35._12_4_ = fStack_14c * fVar189;
  auVar35._16_4_ = fStack_148 * fVar190;
  auVar35._20_4_ = fStack_144 * fVar191;
  auVar35._24_4_ = fStack_140 * fVar192;
  auVar35._28_4_ = local_4e8._28_4_;
  auVar94 = vfnmadd231ps_fma(auVar35,local_118,auVar82);
  auVar36._4_4_ = local_138._4_4_ * fVar268;
  auVar36._0_4_ = local_138._0_4_ * fVar267;
  auVar36._8_4_ = local_138._8_4_ * fVar188;
  auVar36._12_4_ = local_138._12_4_ * fVar189;
  auVar36._16_4_ = local_138._16_4_ * fVar190;
  auVar36._20_4_ = local_138._20_4_ * fVar191;
  auVar36._24_4_ = local_138._24_4_ * fVar192;
  auVar36._28_4_ = local_138._28_4_;
  auVar240 = vfnmadd231ps_fma(auVar36,auVar21,auVar82);
  auVar37._4_4_ = auVar20._4_4_ * fVar268;
  auVar37._0_4_ = auVar20._0_4_ * fVar267;
  auVar37._8_4_ = auVar20._8_4_ * fVar188;
  auVar37._12_4_ = auVar20._12_4_ * fVar189;
  auVar37._16_4_ = auVar20._16_4_ * fVar190;
  auVar37._20_4_ = auVar20._20_4_ * fVar191;
  auVar37._24_4_ = auVar20._24_4_ * fVar192;
  auVar37._28_4_ = auVar81._28_4_ + auVar17._28_4_;
  auVar220 = ZEXT3264(_local_508);
  auVar112 = vfnmadd231ps_fma(auVar37,_local_508,auVar82);
  auVar16 = vminps_avx(ZEXT1632(auVar206),ZEXT1632(auVar127));
  auVar81 = vmaxps_avx(ZEXT1632(auVar206),ZEXT1632(auVar127));
  auVar17 = vminps_avx(ZEXT1632(auVar11),ZEXT1632(auVar66));
  auVar17 = vminps_avx(auVar16,auVar17);
  auVar16 = vmaxps_avx(ZEXT1632(auVar11),ZEXT1632(auVar66));
  auVar81 = vmaxps_avx(auVar81,auVar16);
  auVar18 = vminps_avx(ZEXT1632(auVar246),ZEXT1632(auVar94));
  auVar16 = vmaxps_avx(ZEXT1632(auVar246),ZEXT1632(auVar94));
  auVar10 = vminps_avx(ZEXT1632(auVar240),ZEXT1632(auVar112));
  auVar18 = vminps_avx(auVar18,auVar10);
  auVar18 = vminps_avx(auVar17,auVar18);
  auVar17 = vmaxps_avx(ZEXT1632(auVar240),ZEXT1632(auVar112));
  auVar16 = vmaxps_avx(auVar16,auVar17);
  auVar16 = vmaxps_avx(auVar81,auVar16);
  auVar46._4_4_ = fStack_74;
  auVar46._0_4_ = local_78;
  auVar46._8_4_ = fStack_70;
  auVar46._12_4_ = fStack_6c;
  auVar46._16_4_ = fStack_68;
  auVar46._20_4_ = fStack_64;
  auVar46._24_4_ = fStack_60;
  auVar46._28_4_ = fStack_5c;
  auVar81 = vcmpps_avx(auVar18,auVar46,2);
  auVar45._4_4_ = fStack_94;
  auVar45._0_4_ = local_98;
  auVar45._8_4_ = fStack_90;
  auVar45._12_4_ = fStack_8c;
  auVar45._16_4_ = fStack_88;
  auVar45._20_4_ = fStack_84;
  auVar45._24_4_ = fStack_80;
  auVar45._28_4_ = fStack_7c;
  auVar16 = vcmpps_avx(auVar16,auVar45,5);
  auVar81 = vandps_avx(auVar16,auVar81);
  auVar16 = local_1b8 & auVar81;
  if ((((((((auVar16 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar16 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar16 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar16 >> 0x7f,0) != '\0') ||
        (auVar16 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar16 >> 0xbf,0) != '\0') ||
      (auVar16 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar16[0x1f] < '\0') {
    auVar16 = vsubps_avx(local_4e8,local_b8);
    auVar17 = vsubps_avx(_local_508,auVar253);
    fVar268 = auVar16._0_4_ + auVar17._0_4_;
    fVar188 = auVar16._4_4_ + auVar17._4_4_;
    fVar189 = auVar16._8_4_ + auVar17._8_4_;
    fVar190 = auVar16._12_4_ + auVar17._12_4_;
    fVar191 = auVar16._16_4_ + auVar17._16_4_;
    fVar192 = auVar16._20_4_ + auVar17._20_4_;
    fVar88 = auVar16._24_4_ + auVar17._24_4_;
    auVar18 = vsubps_avx(auVar19,local_f8);
    auVar10 = vsubps_avx(auVar20,ZEXT1632(auVar93));
    auVar109._0_4_ = auVar18._0_4_ + auVar10._0_4_;
    auVar109._4_4_ = auVar18._4_4_ + auVar10._4_4_;
    auVar109._8_4_ = auVar18._8_4_ + auVar10._8_4_;
    auVar109._12_4_ = auVar18._12_4_ + auVar10._12_4_;
    auVar109._16_4_ = auVar18._16_4_ + auVar10._16_4_;
    auVar109._20_4_ = auVar18._20_4_ + auVar10._20_4_;
    auVar109._24_4_ = auVar18._24_4_ + auVar10._24_4_;
    fVar267 = auVar10._28_4_;
    auVar109._28_4_ = auVar18._28_4_ + fVar267;
    auVar38._4_4_ = fVar87 * fVar188;
    auVar38._0_4_ = fVar59 * fVar268;
    auVar38._8_4_ = fVar120 * fVar189;
    auVar38._12_4_ = fVar85 * fVar190;
    auVar38._16_4_ = fVar191 * 0.0;
    auVar38._20_4_ = fVar192 * 0.0;
    auVar38._24_4_ = fVar88 * 0.0;
    auVar38._28_4_ = auVar20._28_4_;
    auVar246 = vfnmadd231ps_fma(auVar38,auVar109,local_b8);
    auVar39._4_4_ = fVar188 * fStack_174;
    auVar39._0_4_ = fVar268 * local_178;
    auVar39._8_4_ = fVar189 * fStack_170;
    auVar39._12_4_ = fVar190 * fStack_16c;
    auVar39._16_4_ = fVar191 * fStack_168;
    auVar39._20_4_ = fVar192 * fStack_164;
    auVar39._24_4_ = fVar88 * fStack_160;
    auVar39._28_4_ = 0;
    auVar206 = vfnmadd213ps_fma(auVar108,auVar109,auVar39);
    auVar40._4_4_ = fVar188 * local_198._4_4_;
    auVar40._0_4_ = fVar268 * local_198._0_4_;
    auVar40._8_4_ = fVar189 * local_198._8_4_;
    auVar40._12_4_ = fVar190 * local_198._12_4_;
    auVar40._16_4_ = fVar191 * local_198._16_4_;
    auVar40._20_4_ = fVar192 * local_198._20_4_;
    auVar40._24_4_ = fVar88 * local_198._24_4_;
    auVar40._28_4_ = 0;
    auVar127 = vfnmadd213ps_fma(local_d8,auVar109,auVar40);
    auVar41._4_4_ = (float)local_648._4_4_ * fVar188;
    auVar41._0_4_ = (float)local_648._0_4_ * fVar268;
    auVar41._8_4_ = (float)uStack_640 * fVar189;
    auVar41._12_4_ = uStack_640._4_4_ * fVar190;
    auVar41._16_4_ = (float)uStack_638 * fVar191;
    auVar41._20_4_ = uStack_638._4_4_ * fVar192;
    auVar41._24_4_ = (float)uStack_630 * fVar88;
    auVar41._28_4_ = 0;
    auVar93 = vfnmadd231ps_fma(auVar41,auVar109,local_4e8);
    auVar130._0_4_ = fVar86 * fVar268;
    auVar130._4_4_ = fVar58 * fVar188;
    auVar130._8_4_ = fVar57 * fVar189;
    auVar130._12_4_ = fVar222 * fVar190;
    auVar130._16_4_ = fVar191 * 0.0;
    auVar130._20_4_ = fVar192 * 0.0;
    auVar130._24_4_ = fVar88 * 0.0;
    auVar130._28_4_ = 0;
    auVar94 = vfnmadd231ps_fma(auVar130,auVar109,auVar253);
    auVar42._4_4_ = fVar188 * fStack_154;
    auVar42._0_4_ = fVar268 * local_158;
    auVar42._8_4_ = fVar189 * fStack_150;
    auVar42._12_4_ = fVar190 * fStack_14c;
    auVar42._16_4_ = fVar191 * fStack_148;
    auVar42._20_4_ = fVar192 * fStack_144;
    auVar42._24_4_ = fVar88 * fStack_140;
    auVar42._28_4_ = fVar267;
    auVar11 = vfnmadd213ps_fma(local_118,auVar109,auVar42);
    auVar43._4_4_ = fVar188 * local_138._4_4_;
    auVar43._0_4_ = fVar268 * local_138._0_4_;
    auVar43._8_4_ = fVar189 * local_138._8_4_;
    auVar43._12_4_ = fVar190 * local_138._12_4_;
    auVar43._16_4_ = fVar191 * local_138._16_4_;
    auVar43._20_4_ = fVar192 * local_138._20_4_;
    auVar43._24_4_ = fVar88 * local_138._24_4_;
    auVar43._28_4_ = fVar267;
    auVar66 = vfnmadd213ps_fma(auVar21,auVar109,auVar43);
    auVar220 = ZEXT1664(auVar66);
    auVar44._4_4_ = fVar188 * auVar20._4_4_;
    auVar44._0_4_ = fVar268 * auVar20._0_4_;
    auVar44._8_4_ = fVar189 * auVar20._8_4_;
    auVar44._12_4_ = fVar190 * auVar20._12_4_;
    auVar44._16_4_ = fVar191 * auVar20._16_4_;
    auVar44._20_4_ = fVar192 * auVar20._20_4_;
    auVar44._24_4_ = fVar88 * auVar20._24_4_;
    auVar44._28_4_ = auVar16._28_4_ + auVar17._28_4_;
    auVar240 = vfnmadd231ps_fma(auVar44,auVar109,_local_508);
    auVar17 = vminps_avx(ZEXT1632(auVar246),ZEXT1632(auVar206));
    auVar16 = vmaxps_avx(ZEXT1632(auVar246),ZEXT1632(auVar206));
    auVar18 = vminps_avx(ZEXT1632(auVar127),ZEXT1632(auVar93));
    auVar18 = vminps_avx(auVar17,auVar18);
    auVar17 = vmaxps_avx(ZEXT1632(auVar127),ZEXT1632(auVar93));
    auVar16 = vmaxps_avx(auVar16,auVar17);
    auVar10 = vminps_avx(ZEXT1632(auVar94),ZEXT1632(auVar11));
    auVar17 = vmaxps_avx(ZEXT1632(auVar94),ZEXT1632(auVar11));
    auVar19 = vminps_avx(ZEXT1632(auVar66),ZEXT1632(auVar240));
    auVar10 = vminps_avx(auVar10,auVar19);
    auVar10 = vminps_avx(auVar18,auVar10);
    auVar18 = vmaxps_avx(ZEXT1632(auVar66),ZEXT1632(auVar240));
    auVar17 = vmaxps_avx(auVar17,auVar18);
    auVar17 = vmaxps_avx(auVar16,auVar17);
    auVar16 = vcmpps_avx(auVar10,auVar46,2);
    auVar17 = vcmpps_avx(auVar17,auVar45,5);
    auVar16 = vandps_avx(auVar17,auVar16);
    auVar81 = vandps_avx(auVar81,local_1b8);
    auVar17 = auVar81 & auVar16;
    if ((((((((auVar17 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar17 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar17 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar17 >> 0x7f,0) != '\0') ||
          (auVar17 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar17 >> 0xbf,0) != '\0') ||
        (auVar17 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar17[0x1f] < '\0')
    {
      auVar81 = vandps_avx(auVar16,auVar81);
      uVar53 = vmovmskps_avx(auVar81);
      if (uVar53 != 0) {
        mask_stack[uVar55] = uVar53 & 0xff;
        BVar1 = (BBox1f)vmovlps_avx(auVar105);
        cu_stack[uVar55] = BVar1;
        BVar1 = (BBox1f)vmovlps_avx(auVar67);
        cv_stack[uVar55] = BVar1;
        uVar55 = uVar55 + 1;
      }
    }
  }
LAB_0115b66c:
  if (uVar55 == 0) {
    uVar54 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar80._4_4_ = uVar54;
    auVar80._0_4_ = uVar54;
    auVar80._8_4_ = uVar54;
    auVar80._12_4_ = uVar54;
    auVar105 = vcmpps_avx(auVar194,auVar80,2);
    uVar47 = vmovmskps_avx(auVar105);
    uVar48 = (ulong)((uint)uVar48 & (uint)local_510 & uVar47);
    goto LAB_0115a949;
  }
  uVar53 = uVar55 - 1;
  uVar52 = mask_stack[uVar53];
  fVar59 = cu_stack[uVar53].lower;
  fVar87 = cu_stack[uVar53].upper;
  iVar22 = 0;
  for (uVar49 = (ulong)uVar52; (uVar49 & 1) == 0; uVar49 = uVar49 >> 1 | 0x8000000000000000) {
    iVar22 = iVar22 + 1;
  }
  uVar52 = uVar52 - 1 & uVar52;
  if (uVar52 == 0) {
    uVar55 = uVar53;
  }
  auVar67._8_8_ = 0;
  auVar67._0_4_ = cv_stack[uVar53].lower;
  auVar67._4_4_ = cv_stack[uVar53].upper;
  mask_stack[uVar53] = uVar52;
  fVar120 = (float)(iVar22 + 1) * 0.14285715;
  auVar105 = vfmadd231ss_fma(ZEXT416((uint)(fVar87 * (float)iVar22 * 0.14285715)),
                             ZEXT416((uint)fVar59),ZEXT416((uint)(1.0 - (float)iVar22 * 0.14285715))
                            );
  auVar206 = vfmadd231ss_fma(ZEXT416((uint)(fVar87 * fVar120)),ZEXT416((uint)fVar59),
                             ZEXT416((uint)(1.0 - fVar120)));
  fVar87 = auVar206._0_4_;
  auVar187._0_4_ = auVar105._0_4_;
  fVar59 = fVar87 - auVar187._0_4_;
  if (fVar59 < 0.16666667) {
    auVar127 = vshufps_avx(auVar67,auVar67,0x50);
    auVar95._8_4_ = 0x3f800000;
    auVar95._0_8_ = 0x3f8000003f800000;
    auVar95._12_4_ = 0x3f800000;
    auVar11 = vsubps_avx(auVar95,auVar127);
    fVar120 = auVar127._0_4_;
    auVar137._0_4_ = fVar120 * fVar132;
    fVar85 = auVar127._4_4_;
    auVar137._4_4_ = fVar85 * fVar143;
    fVar86 = auVar127._8_4_;
    auVar137._8_4_ = fVar86 * fVar132;
    fVar58 = auVar127._12_4_;
    auVar137._12_4_ = fVar58 * fVar143;
    auVar148._0_4_ = fVar120 * fVar254;
    auVar148._4_4_ = fVar85 * fVar266;
    auVar148._8_4_ = fVar86 * fVar254;
    auVar148._12_4_ = fVar58 * fVar266;
    auVar169._0_4_ = fVar120 * fVar193;
    auVar169._4_4_ = fVar85 * fVar203;
    auVar169._8_4_ = fVar86 * fVar193;
    auVar169._12_4_ = fVar58 * fVar203;
    auVar69._0_4_ = fVar120 * fVar204;
    auVar69._4_4_ = fVar85 * fVar221;
    auVar69._8_4_ = fVar86 * fVar204;
    auVar69._12_4_ = fVar58 * fVar221;
    auVar127 = vfmadd231ps_fma(auVar137,auVar11,auVar180);
    auVar66 = vfmadd231ps_fma(auVar148,auVar11,auVar227);
    auVar246 = vfmadd231ps_fma(auVar169,auVar11,auVar245);
    auVar11 = vfmadd231ps_fma(auVar69,auVar11,auVar257);
    auVar131._16_16_ = auVar127;
    auVar131._0_16_ = auVar127;
    auVar142._16_16_ = auVar66;
    auVar142._0_16_ = auVar66;
    auVar156._16_16_ = auVar246;
    auVar156._0_16_ = auVar246;
    auVar187._4_4_ = auVar187._0_4_;
    auVar187._8_4_ = auVar187._0_4_;
    auVar187._12_4_ = auVar187._0_4_;
    auVar187._20_4_ = fVar87;
    auVar187._16_4_ = fVar87;
    auVar187._24_4_ = fVar87;
    auVar187._28_4_ = fVar87;
    auVar81 = vsubps_avx(auVar142,auVar131);
    auVar66 = vfmadd213ps_fma(auVar81,auVar187,auVar131);
    auVar81 = vsubps_avx(auVar156,auVar142);
    auVar93 = vfmadd213ps_fma(auVar81,auVar187,auVar142);
    auVar127 = vsubps_avx(auVar11,auVar246);
    auVar83._16_16_ = auVar127;
    auVar83._0_16_ = auVar127;
    auVar127 = vfmadd213ps_fma(auVar83,auVar187,auVar156);
    auVar81 = vsubps_avx(ZEXT1632(auVar93),ZEXT1632(auVar66));
    auVar11 = vfmadd213ps_fma(auVar81,auVar187,ZEXT1632(auVar66));
    auVar81 = vsubps_avx(ZEXT1632(auVar127),ZEXT1632(auVar93));
    auVar127 = vfmadd213ps_fma(auVar81,auVar187,ZEXT1632(auVar93));
    auVar81 = vsubps_avx(ZEXT1632(auVar127),ZEXT1632(auVar11));
    auVar112 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar81,auVar187);
    fVar222 = auVar81._4_4_ * 3.0;
    local_4e8._0_4_ = fVar59;
    fVar120 = fVar59 * 0.33333334;
    auVar96._0_8_ =
         CONCAT44(auVar112._4_4_ + fVar120 * fVar222,auVar112._0_4_ + fVar120 * auVar81._0_4_ * 3.0)
    ;
    auVar96._8_4_ = auVar112._8_4_ + fVar120 * auVar81._8_4_ * 3.0;
    auVar96._12_4_ = auVar112._12_4_ + fVar120 * auVar81._12_4_ * 3.0;
    auVar11 = vshufpd_avx(auVar112,auVar112,3);
    auVar66 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
    _local_508 = auVar11;
    auVar127 = vsubps_avx(auVar11,auVar112);
    auVar246 = vsubps_avx(auVar66,(undefined1  [16])0x0);
    auVar70._0_4_ = auVar127._0_4_ + auVar246._0_4_;
    auVar70._4_4_ = auVar127._4_4_ + auVar246._4_4_;
    auVar70._8_4_ = auVar127._8_4_ + auVar246._8_4_;
    auVar70._12_4_ = auVar127._12_4_ + auVar246._12_4_;
    auVar127 = vshufps_avx(auVar112,auVar112,0xb1);
    auVar246 = vshufps_avx(auVar96,auVar96,0xb1);
    auVar272._4_4_ = auVar70._0_4_;
    auVar272._0_4_ = auVar70._0_4_;
    auVar272._8_4_ = auVar70._0_4_;
    auVar272._12_4_ = auVar70._0_4_;
    auVar93 = vshufps_avx(auVar70,auVar70,0x55);
    fVar85 = auVar93._0_4_;
    auVar71._0_4_ = fVar85 * auVar127._0_4_;
    fVar86 = auVar93._4_4_;
    auVar71._4_4_ = fVar86 * auVar127._4_4_;
    fVar58 = auVar93._8_4_;
    auVar71._8_4_ = fVar58 * auVar127._8_4_;
    fVar57 = auVar93._12_4_;
    auVar71._12_4_ = fVar57 * auVar127._12_4_;
    auVar149._0_4_ = fVar85 * auVar246._0_4_;
    auVar149._4_4_ = fVar86 * auVar246._4_4_;
    auVar149._8_4_ = fVar58 * auVar246._8_4_;
    auVar149._12_4_ = fVar57 * auVar246._12_4_;
    auVar94 = vfmadd231ps_fma(auVar71,auVar272,auVar112);
    auVar240 = vfmadd231ps_fma(auVar149,auVar272,auVar96);
    auVar246 = vshufps_avx(auVar94,auVar94,0xe8);
    auVar93 = vshufps_avx(auVar240,auVar240,0xe8);
    auVar127 = vcmpps_avx(auVar246,auVar93,1);
    uVar53 = vextractps_avx(auVar127,0);
    auVar135 = auVar240;
    if ((uVar53 & 1) == 0) {
      auVar135 = auVar94;
    }
    auVar123._0_4_ = fVar120 * auVar81._16_4_ * 3.0;
    auVar123._4_4_ = fVar120 * fVar222;
    auVar123._8_4_ = fVar120 * auVar81._24_4_ * 3.0;
    auVar123._12_4_ = fVar120 * auVar220._28_4_;
    auVar160 = vsubps_avx((undefined1  [16])0x0,auVar123);
    auVar124 = vshufps_avx(auVar160,auVar160,0xb1);
    auVar147 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
    auVar181._0_4_ = fVar85 * auVar124._0_4_;
    auVar181._4_4_ = fVar86 * auVar124._4_4_;
    auVar181._8_4_ = fVar58 * auVar124._8_4_;
    auVar181._12_4_ = fVar57 * auVar124._12_4_;
    auVar198._0_4_ = auVar147._0_4_ * fVar85;
    auVar198._4_4_ = auVar147._4_4_ * fVar86;
    auVar198._8_4_ = auVar147._8_4_ * fVar58;
    auVar198._12_4_ = auVar147._12_4_ * fVar57;
    auVar161 = vfmadd231ps_fma(auVar181,auVar272,auVar160);
    auVar162 = vfmadd231ps_fma(auVar198,(undefined1  [16])0x0,auVar272);
    auVar147 = vshufps_avx(auVar161,auVar161,0xe8);
    auVar159 = vshufps_avx(auVar162,auVar162,0xe8);
    auVar220 = ZEXT1664(auVar159);
    auVar124 = vcmpps_avx(auVar147,auVar159,1);
    uVar53 = vextractps_avx(auVar124,0);
    auVar163 = auVar162;
    if ((uVar53 & 1) == 0) {
      auVar163 = auVar161;
    }
    auVar135 = vmaxss_avx(auVar163,auVar135);
    auVar246 = vminps_avx(auVar246,auVar93);
    auVar93 = vminps_avx(auVar147,auVar159);
    auVar93 = vminps_avx(auVar246,auVar93);
    auVar127 = vshufps_avx(auVar127,auVar127,0x55);
    auVar127 = vblendps_avx(auVar127,auVar124,2);
    auVar124 = vpslld_avx(auVar127,0x1f);
    auVar127 = vshufpd_avx(auVar240,auVar240,1);
    auVar127 = vinsertps_avx(auVar127,auVar162,0x9c);
    auVar246 = vshufpd_avx(auVar94,auVar94,1);
    auVar246 = vinsertps_avx(auVar246,auVar161,0x9c);
    auVar127 = vblendvps_avx(auVar246,auVar127,auVar124);
    auVar246 = vmovshdup_avx(auVar127);
    auVar127 = vmaxss_avx(auVar246,auVar127);
    fVar58 = auVar93._0_4_;
    auVar246 = vmovshdup_avx(auVar93);
    fVar86 = auVar127._0_4_;
    fVar120 = auVar246._0_4_;
    fVar85 = auVar135._0_4_;
    if (((0.0001 <= fVar58) || (fVar86 <= -0.0001)) && (0.0001 <= fVar120 || fVar86 <= -0.0001))
    goto code_r0x0115b976;
    goto LAB_0115b99c;
  }
  auVar105 = vinsertps_avx(auVar105,auVar206,0x10);
  goto LAB_0115b0bc;
code_r0x0115b976:
  auVar246 = vcmpps_avx(auVar246,SUB6416(ZEXT464(0x38d1b717),0),5);
  auVar94 = vcmpps_avx(auVar93,SUB6416(ZEXT464(0x38d1b717),0),5);
  auVar246 = vandps_avx(auVar94,auVar246);
  if (fVar85 <= -0.0001 || (auVar246 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
  goto LAB_0115b66c;
LAB_0115b99c:
  auVar94 = vcmpps_avx(auVar93,_DAT_01f45a50,1);
  auVar240 = SUB6416(ZEXT864(0),0) << 0x20;
  auVar246 = vcmpss_avx(auVar135,ZEXT816(0) << 0x20,1);
  auVar97._8_4_ = 0x3f800000;
  auVar97._0_8_ = 0x3f8000003f800000;
  auVar97._12_4_ = 0x3f800000;
  auVar114._8_4_ = 0xbf800000;
  auVar114._0_8_ = 0xbf800000bf800000;
  auVar114._12_4_ = 0xbf800000;
  auVar246 = vblendvps_avx(auVar97,auVar114,auVar246);
  auVar94 = vblendvps_avx(auVar97,auVar114,auVar94);
  fVar222 = auVar94._0_4_;
  fVar57 = auVar246._0_4_;
  auVar246 = SUB6416(ZEXT864(0),0) << 0x20;
  if ((fVar222 == fVar57) && (!NAN(fVar222) && !NAN(fVar57))) {
    auVar246 = SUB6416(ZEXT464(0x7f800000),0);
  }
  if ((fVar222 == fVar57) && (!NAN(fVar222) && !NAN(fVar57))) {
    auVar240 = SUB6416(ZEXT464(0xff800000),0);
  }
  auVar94 = vmovshdup_avx(auVar94);
  fVar267 = auVar94._0_4_;
  if ((fVar222 != fVar267) || (NAN(fVar222) || NAN(fVar267))) {
    if ((fVar120 != fVar58) || (NAN(fVar120) || NAN(fVar58))) {
      auVar125._0_8_ = auVar93._0_8_ ^ 0x8000000080000000;
      auVar125._8_4_ = auVar93._8_4_ ^ 0x80000000;
      auVar125._12_4_ = auVar93._12_4_ ^ 0x80000000;
      auVar126._0_4_ = -fVar58 / (fVar120 - fVar58);
      auVar126._4_12_ = auVar125._4_12_;
      auVar93 = vfmadd132ss_fma(ZEXT416((uint)(1.0 - auVar126._0_4_)),auVar126,ZEXT416(0));
      auVar94 = auVar93;
    }
    else {
      auVar93 = ZEXT816(0) << 0x20;
      if ((fVar58 != 0.0) || (auVar94 = SUB6416(ZEXT464(0x3f800000),0), NAN(fVar58))) {
        auVar93 = SUB6416(ZEXT464(0x7f800000),0);
        auVar94 = SUB6416(ZEXT464(0xff800000),0);
      }
    }
    auVar246 = vminss_avx(auVar246,auVar93);
    auVar240 = vmaxss_avx(auVar94,auVar240);
  }
  auVar127 = vcmpss_avx(auVar127,ZEXT416(0),1);
  auVar98._8_4_ = 0x3f800000;
  auVar98._0_8_ = 0x3f8000003f800000;
  auVar98._12_4_ = 0x3f800000;
  auVar115._8_4_ = 0xbf800000;
  auVar115._0_8_ = 0xbf800000bf800000;
  auVar115._12_4_ = 0xbf800000;
  auVar127 = vblendvps_avx(auVar98,auVar115,auVar127);
  fVar120 = auVar127._0_4_;
  if ((fVar57 != fVar120) || (NAN(fVar57) || NAN(fVar120))) {
    if ((fVar86 != fVar85) || (NAN(fVar86) || NAN(fVar85))) {
      auVar72._0_8_ = auVar135._0_8_ ^ 0x8000000080000000;
      auVar72._8_4_ = auVar135._8_4_ ^ 0x80000000;
      auVar72._12_4_ = auVar135._12_4_ ^ 0x80000000;
      auVar128._0_4_ = -fVar85 / (fVar86 - fVar85);
      auVar128._4_12_ = auVar72._4_12_;
      auVar127 = vfmadd132ss_fma(ZEXT416((uint)(1.0 - auVar128._0_4_)),auVar128,ZEXT416(0));
      auVar93 = auVar127;
    }
    else {
      auVar127 = SUB6416(ZEXT464(0x3f800000),0);
      if ((fVar85 != 0.0) || (auVar93 = SUB6416(ZEXT864(0),0) << 0x20, NAN(fVar85))) {
        auVar127 = SUB6416(ZEXT464(0xff800000),0);
        auVar93 = SUB6416(ZEXT464(0x7f800000),0);
      }
    }
    auVar246 = vminss_avx(auVar246,auVar93);
    auVar240 = vmaxss_avx(auVar127,auVar240);
  }
  if ((fVar267 != fVar120) || (NAN(fVar267) || NAN(fVar120))) {
    auVar246 = vminss_avx(auVar246,SUB6416(ZEXT464(0x3f800000),0));
    auVar240 = vmaxss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar240);
  }
  auVar127 = vmaxss_avx(ZEXT816(0) << 0x40,auVar246);
  auVar246 = vminss_avx(auVar240,SUB6416(ZEXT464(0x3f800000),0));
  if (auVar246._0_4_ < auVar127._0_4_) goto LAB_0115b66c;
  auVar127 = vmaxss_avx(ZEXT816(0),ZEXT416((uint)(auVar127._0_4_ + -0.1)));
  auVar246 = vminss_avx(ZEXT416((uint)(auVar246._0_4_ + 0.1)),SUB6416(ZEXT464(0x3f800000),0));
  auVar138._0_8_ = auVar112._0_8_;
  auVar138._8_8_ = auVar138._0_8_;
  auVar212._8_8_ = auVar96._0_8_;
  auVar212._0_8_ = auVar96._0_8_;
  auVar228._8_8_ = auVar160._0_8_;
  auVar228._0_8_ = auVar160._0_8_;
  auVar93 = vshufpd_avx(auVar96,auVar96,3);
  auVar94 = vshufpd_avx(auVar160,auVar160,3);
  auVar240 = vshufps_avx(auVar127,auVar246,0);
  auVar73._8_4_ = 0x3f800000;
  auVar73._0_8_ = 0x3f8000003f800000;
  auVar73._12_4_ = 0x3f800000;
  auVar112 = vsubps_avx(auVar73,auVar240);
  local_508._0_4_ = auVar11._0_4_;
  local_508._4_4_ = auVar11._4_4_;
  fStack_500 = auVar11._8_4_;
  fStack_4fc = auVar11._12_4_;
  fVar120 = auVar240._0_4_;
  auVar74._0_4_ = fVar120 * (float)local_508._0_4_;
  fVar85 = auVar240._4_4_;
  auVar74._4_4_ = fVar85 * (float)local_508._4_4_;
  fVar86 = auVar240._8_4_;
  auVar74._8_4_ = fVar86 * fStack_500;
  fVar58 = auVar240._12_4_;
  auVar74._12_4_ = fVar58 * fStack_4fc;
  auVar170._0_4_ = fVar120 * auVar93._0_4_;
  auVar170._4_4_ = fVar85 * auVar93._4_4_;
  auVar170._8_4_ = fVar86 * auVar93._8_4_;
  auVar170._12_4_ = fVar58 * auVar93._12_4_;
  auVar182._0_4_ = fVar120 * auVar94._0_4_;
  auVar182._4_4_ = fVar85 * auVar94._4_4_;
  auVar182._8_4_ = fVar86 * auVar94._8_4_;
  auVar182._12_4_ = fVar58 * auVar94._12_4_;
  auVar199._0_4_ = fVar120 * auVar66._0_4_;
  auVar199._4_4_ = fVar85 * auVar66._4_4_;
  auVar199._8_4_ = fVar86 * auVar66._8_4_;
  auVar199._12_4_ = fVar58 * auVar66._12_4_;
  auVar93 = vfmadd231ps_fma(auVar74,auVar112,auVar138);
  auVar94 = vfmadd231ps_fma(auVar170,auVar112,auVar212);
  auVar240 = vfmadd231ps_fma(auVar182,auVar112,auVar228);
  auVar112 = vfmadd231ps_fma(auVar199,auVar112,ZEXT816(0));
  auVar11 = vmovshdup_avx(auVar67);
  auVar159 = vfmadd231ss_fma(ZEXT416((uint)(auVar11._0_4_ * auVar127._0_4_)),auVar67,
                             ZEXT416((uint)(1.0 - auVar127._0_4_)));
  auVar160 = vfmadd231ss_fma(ZEXT416((uint)(auVar11._0_4_ * auVar246._0_4_)),auVar67,
                             ZEXT416((uint)(1.0 - auVar246._0_4_)));
  fVar120 = 1.0 / fVar59;
  auVar67 = vsubps_avx(auVar94,auVar93);
  auVar213._0_4_ = auVar67._0_4_ * 3.0;
  auVar213._4_4_ = auVar67._4_4_ * 3.0;
  auVar213._8_4_ = auVar67._8_4_ * 3.0;
  auVar213._12_4_ = auVar67._12_4_ * 3.0;
  auVar67 = vsubps_avx(auVar240,auVar94);
  auVar229._0_4_ = auVar67._0_4_ * 3.0;
  auVar229._4_4_ = auVar67._4_4_ * 3.0;
  auVar229._8_4_ = auVar67._8_4_ * 3.0;
  auVar229._12_4_ = auVar67._12_4_ * 3.0;
  auVar67 = vsubps_avx(auVar112,auVar240);
  auVar241._0_4_ = auVar67._0_4_ * 3.0;
  auVar241._4_4_ = auVar67._4_4_ * 3.0;
  auVar241._8_4_ = auVar67._8_4_ * 3.0;
  auVar241._12_4_ = auVar67._12_4_ * 3.0;
  auVar127 = vminps_avx(auVar229,auVar241);
  auVar67 = vmaxps_avx(auVar229,auVar241);
  auVar127 = vminps_avx(auVar213,auVar127);
  auVar67 = vmaxps_avx(auVar213,auVar67);
  auVar11 = vshufpd_avx(auVar127,auVar127,3);
  auVar66 = vshufpd_avx(auVar67,auVar67,3);
  auVar127 = vminps_avx(auVar127,auVar11);
  auVar67 = vmaxps_avx(auVar67,auVar66);
  auVar230._0_4_ = auVar127._0_4_ * fVar120;
  auVar230._4_4_ = auVar127._4_4_ * fVar120;
  auVar230._8_4_ = auVar127._8_4_ * fVar120;
  auVar230._12_4_ = auVar127._12_4_ * fVar120;
  auVar214._0_4_ = auVar67._0_4_ * fVar120;
  auVar214._4_4_ = auVar67._4_4_ * fVar120;
  auVar214._8_4_ = auVar67._8_4_ * fVar120;
  auVar214._12_4_ = auVar67._12_4_ * fVar120;
  fVar120 = 1.0 / (auVar160._0_4_ - auVar159._0_4_);
  auVar67 = vshufpd_avx(auVar93,auVar93,3);
  auVar127 = vshufpd_avx(auVar94,auVar94,3);
  auVar11 = vshufpd_avx(auVar240,auVar240,3);
  auVar66 = vshufpd_avx(auVar112,auVar112,3);
  auVar67 = vsubps_avx(auVar67,auVar93);
  auVar246 = vsubps_avx(auVar127,auVar94);
  auVar93 = vsubps_avx(auVar11,auVar240);
  auVar66 = vsubps_avx(auVar66,auVar112);
  auVar127 = vminps_avx(auVar67,auVar246);
  auVar67 = vmaxps_avx(auVar67,auVar246);
  auVar11 = vminps_avx(auVar93,auVar66);
  auVar11 = vminps_avx(auVar127,auVar11);
  auVar127 = vmaxps_avx(auVar93,auVar66);
  auVar67 = vmaxps_avx(auVar67,auVar127);
  auVar258._0_4_ = fVar120 * auVar11._0_4_;
  auVar258._4_4_ = fVar120 * auVar11._4_4_;
  auVar258._8_4_ = fVar120 * auVar11._8_4_;
  auVar258._12_4_ = fVar120 * auVar11._12_4_;
  auVar247._0_4_ = fVar120 * auVar67._0_4_;
  auVar247._4_4_ = fVar120 * auVar67._4_4_;
  auVar247._8_4_ = fVar120 * auVar67._8_4_;
  auVar247._12_4_ = fVar120 * auVar67._12_4_;
  auVar66 = vinsertps_avx(auVar105,auVar159,0x10);
  auVar246 = vinsertps_avx(auVar206,auVar160,0x10);
  auVar242._0_4_ = (auVar66._0_4_ + auVar246._0_4_) * 0.5;
  auVar242._4_4_ = (auVar66._4_4_ + auVar246._4_4_) * 0.5;
  auVar242._8_4_ = (auVar66._8_4_ + auVar246._8_4_) * 0.5;
  auVar242._12_4_ = (auVar66._12_4_ + auVar246._12_4_) * 0.5;
  auVar75._4_4_ = auVar242._0_4_;
  auVar75._0_4_ = auVar242._0_4_;
  auVar75._8_4_ = auVar242._0_4_;
  auVar75._12_4_ = auVar242._0_4_;
  auVar67 = vfmadd213ps_fma(auVar9,auVar75,auVar13);
  auVar127 = vfmadd213ps_fma(auVar12,auVar75,auVar14);
  auVar11 = vfmadd213ps_fma(auVar146,auVar75,auVar15);
  auVar206 = vsubps_avx(auVar127,auVar67);
  auVar67 = vfmadd213ps_fma(auVar206,auVar75,auVar67);
  auVar206 = vsubps_avx(auVar11,auVar127);
  auVar206 = vfmadd213ps_fma(auVar206,auVar75,auVar127);
  auVar206 = vsubps_avx(auVar206,auVar67);
  auVar67 = vfmadd231ps_fma(auVar67,auVar206,auVar75);
  auVar76._0_8_ = CONCAT44(auVar206._4_4_ * 3.0,auVar206._0_4_ * 3.0);
  auVar76._8_4_ = auVar206._8_4_ * 3.0;
  auVar76._12_4_ = auVar206._12_4_ * 3.0;
  auVar273._8_8_ = auVar67._0_8_;
  auVar273._0_8_ = auVar67._0_8_;
  auVar206 = vshufpd_avx(auVar67,auVar67,3);
  auVar67 = vshufps_avx(auVar242,auVar242,0x55);
  auVar94 = vsubps_avx(auVar206,auVar273);
  auVar112 = vfmadd231ps_fma(auVar273,auVar67,auVar94);
  auVar280._8_8_ = auVar76._0_8_;
  auVar280._0_8_ = auVar76._0_8_;
  auVar206 = vshufpd_avx(auVar76,auVar76,3);
  auVar206 = vsubps_avx(auVar206,auVar280);
  auVar240 = vfmadd213ps_fma(auVar206,auVar67,auVar280);
  auVar67 = vmovshdup_avx(auVar240);
  auVar281._0_8_ = auVar67._0_8_ ^ 0x8000000080000000;
  auVar281._8_4_ = auVar67._8_4_ ^ 0x80000000;
  auVar281._12_4_ = auVar67._12_4_ ^ 0x80000000;
  auVar127 = vmovshdup_avx(auVar94);
  auVar206 = vunpcklps_avx(auVar127,auVar281);
  auVar11 = vshufps_avx(auVar206,auVar281,4);
  auVar93 = vshufps_avx(auVar242,auVar242,0x54);
  auVar129._0_8_ = auVar94._0_8_ ^ 0x8000000080000000;
  auVar129._8_4_ = auVar94._8_4_ ^ 0x80000000;
  auVar129._12_4_ = auVar94._12_4_ ^ 0x80000000;
  auVar206 = vmovlhps_avx(auVar129,auVar240);
  auVar206 = vshufps_avx(auVar206,auVar240,8);
  auVar67 = vfmsub231ss_fma(ZEXT416((uint)(auVar94._0_4_ * auVar67._0_4_)),auVar127,auVar240);
  uVar54 = auVar67._0_4_;
  auVar77._4_4_ = uVar54;
  auVar77._0_4_ = uVar54;
  auVar77._8_4_ = uVar54;
  auVar77._12_4_ = uVar54;
  auVar67 = vdivps_avx(auVar11,auVar77);
  auVar127 = vdivps_avx(auVar206,auVar77);
  fVar86 = auVar112._0_4_;
  fVar120 = auVar67._0_4_;
  auVar206 = vshufps_avx(auVar112,auVar112,0x55);
  fVar85 = auVar127._0_4_;
  auVar78._0_4_ = fVar86 * fVar120 + auVar206._0_4_ * fVar85;
  auVar78._4_4_ = fVar86 * auVar67._4_4_ + auVar206._4_4_ * auVar127._4_4_;
  auVar78._8_4_ = fVar86 * auVar67._8_4_ + auVar206._8_4_ * auVar127._8_4_;
  auVar78._12_4_ = fVar86 * auVar67._12_4_ + auVar206._12_4_ * auVar127._12_4_;
  auVar147 = vsubps_avx(auVar93,auVar78);
  auVar93 = vmovshdup_avx(auVar67);
  auVar206 = vinsertps_avx(auVar230,auVar258,0x1c);
  auVar150._0_4_ = auVar93._0_4_ * auVar206._0_4_;
  auVar150._4_4_ = auVar93._4_4_ * auVar206._4_4_;
  auVar150._8_4_ = auVar93._8_4_ * auVar206._8_4_;
  auVar150._12_4_ = auVar93._12_4_ * auVar206._12_4_;
  auVar11 = vinsertps_avx(auVar214,auVar247,0x1c);
  auVar99._0_4_ = auVar11._0_4_ * auVar93._0_4_;
  auVar99._4_4_ = auVar11._4_4_ * auVar93._4_4_;
  auVar99._8_4_ = auVar11._8_4_ * auVar93._8_4_;
  auVar99._12_4_ = auVar11._12_4_ * auVar93._12_4_;
  auVar112 = vminps_avx(auVar150,auVar99);
  auVar240 = vmaxps_avx(auVar99,auVar150);
  auVar93 = vinsertps_avx(auVar258,auVar230,0x4c);
  auVar135 = vmovshdup_avx(auVar127);
  auVar94 = vinsertps_avx(auVar247,auVar214,0x4c);
  auVar248._0_4_ = auVar135._0_4_ * auVar93._0_4_;
  auVar248._4_4_ = auVar135._4_4_ * auVar93._4_4_;
  auVar248._8_4_ = auVar135._8_4_ * auVar93._8_4_;
  auVar248._12_4_ = auVar135._12_4_ * auVar93._12_4_;
  auVar231._0_4_ = auVar135._0_4_ * auVar94._0_4_;
  auVar231._4_4_ = auVar135._4_4_ * auVar94._4_4_;
  auVar231._8_4_ = auVar135._8_4_ * auVar94._8_4_;
  auVar231._12_4_ = auVar135._12_4_ * auVar94._12_4_;
  auVar135 = vminps_avx(auVar248,auVar231);
  auVar259._0_4_ = auVar112._0_4_ + auVar135._0_4_;
  auVar259._4_4_ = auVar112._4_4_ + auVar135._4_4_;
  auVar259._8_4_ = auVar112._8_4_ + auVar135._8_4_;
  auVar259._12_4_ = auVar112._12_4_ + auVar135._12_4_;
  auVar112 = vmaxps_avx(auVar231,auVar248);
  auVar100._0_4_ = auVar112._0_4_ + auVar240._0_4_;
  auVar100._4_4_ = auVar112._4_4_ + auVar240._4_4_;
  auVar100._8_4_ = auVar112._8_4_ + auVar240._8_4_;
  auVar100._12_4_ = auVar112._12_4_ + auVar240._12_4_;
  auVar232._8_8_ = 0x3f80000000000000;
  auVar232._0_8_ = 0x3f80000000000000;
  auVar240 = vsubps_avx(auVar232,auVar100);
  auVar112 = vsubps_avx(auVar232,auVar259);
  auVar135 = vsubps_avx(auVar66,auVar242);
  auVar124 = vsubps_avx(auVar246,auVar242);
  auVar116._0_4_ = fVar120 * auVar206._0_4_;
  auVar116._4_4_ = fVar120 * auVar206._4_4_;
  auVar116._8_4_ = fVar120 * auVar206._8_4_;
  auVar116._12_4_ = fVar120 * auVar206._12_4_;
  auVar260._0_4_ = fVar120 * auVar11._0_4_;
  auVar260._4_4_ = fVar120 * auVar11._4_4_;
  auVar260._8_4_ = fVar120 * auVar11._8_4_;
  auVar260._12_4_ = fVar120 * auVar11._12_4_;
  auVar11 = vminps_avx(auVar116,auVar260);
  auVar206 = vmaxps_avx(auVar260,auVar116);
  auVar151._0_4_ = fVar85 * auVar93._0_4_;
  auVar151._4_4_ = fVar85 * auVar93._4_4_;
  auVar151._8_4_ = fVar85 * auVar93._8_4_;
  auVar151._12_4_ = fVar85 * auVar93._12_4_;
  auVar215._0_4_ = fVar85 * auVar94._0_4_;
  auVar215._4_4_ = fVar85 * auVar94._4_4_;
  auVar215._8_4_ = fVar85 * auVar94._8_4_;
  auVar215._12_4_ = fVar85 * auVar94._12_4_;
  auVar93 = vminps_avx(auVar151,auVar215);
  auVar261._0_4_ = auVar11._0_4_ + auVar93._0_4_;
  auVar261._4_4_ = auVar11._4_4_ + auVar93._4_4_;
  auVar261._8_4_ = auVar11._8_4_ + auVar93._8_4_;
  auVar261._12_4_ = auVar11._12_4_ + auVar93._12_4_;
  fVar267 = auVar135._0_4_;
  auVar274._0_4_ = fVar267 * auVar240._0_4_;
  fVar268 = auVar135._4_4_;
  auVar274._4_4_ = fVar268 * auVar240._4_4_;
  fVar188 = auVar135._8_4_;
  auVar274._8_4_ = fVar188 * auVar240._8_4_;
  fVar189 = auVar135._12_4_;
  auVar274._12_4_ = fVar189 * auVar240._12_4_;
  auVar11 = vmaxps_avx(auVar215,auVar151);
  auVar216._0_4_ = fVar267 * auVar112._0_4_;
  auVar216._4_4_ = fVar268 * auVar112._4_4_;
  auVar216._8_4_ = fVar188 * auVar112._8_4_;
  auVar216._12_4_ = fVar189 * auVar112._12_4_;
  fVar86 = auVar124._0_4_;
  auVar101._0_4_ = fVar86 * auVar240._0_4_;
  fVar58 = auVar124._4_4_;
  auVar101._4_4_ = fVar58 * auVar240._4_4_;
  fVar57 = auVar124._8_4_;
  auVar101._8_4_ = fVar57 * auVar240._8_4_;
  fVar222 = auVar124._12_4_;
  auVar101._12_4_ = fVar222 * auVar240._12_4_;
  auVar233._0_4_ = fVar86 * auVar112._0_4_;
  auVar233._4_4_ = fVar58 * auVar112._4_4_;
  auVar233._8_4_ = fVar57 * auVar112._8_4_;
  auVar233._12_4_ = fVar222 * auVar112._12_4_;
  auVar117._0_4_ = auVar206._0_4_ + auVar11._0_4_;
  auVar117._4_4_ = auVar206._4_4_ + auVar11._4_4_;
  auVar117._8_4_ = auVar206._8_4_ + auVar11._8_4_;
  auVar117._12_4_ = auVar206._12_4_ + auVar11._12_4_;
  auVar152._8_8_ = 0x3f800000;
  auVar152._0_8_ = 0x3f800000;
  auVar206 = vsubps_avx(auVar152,auVar117);
  auVar11 = vsubps_avx(auVar152,auVar261);
  auVar262._0_4_ = fVar267 * auVar206._0_4_;
  auVar262._4_4_ = fVar268 * auVar206._4_4_;
  auVar262._8_4_ = fVar188 * auVar206._8_4_;
  auVar262._12_4_ = fVar189 * auVar206._12_4_;
  auVar249._0_4_ = fVar267 * auVar11._0_4_;
  auVar249._4_4_ = fVar268 * auVar11._4_4_;
  auVar249._8_4_ = fVar188 * auVar11._8_4_;
  auVar249._12_4_ = fVar189 * auVar11._12_4_;
  auVar118._0_4_ = fVar86 * auVar206._0_4_;
  auVar118._4_4_ = fVar58 * auVar206._4_4_;
  auVar118._8_4_ = fVar57 * auVar206._8_4_;
  auVar118._12_4_ = fVar222 * auVar206._12_4_;
  auVar153._0_4_ = fVar86 * auVar11._0_4_;
  auVar153._4_4_ = fVar58 * auVar11._4_4_;
  auVar153._8_4_ = fVar57 * auVar11._8_4_;
  auVar153._12_4_ = fVar222 * auVar11._12_4_;
  auVar206 = vminps_avx(auVar262,auVar249);
  auVar11 = vminps_avx(auVar118,auVar153);
  auVar206 = vminps_avx(auVar206,auVar11);
  auVar11 = vmaxps_avx(auVar249,auVar262);
  auVar93 = vmaxps_avx(auVar153,auVar118);
  auVar94 = vminps_avx(auVar274,auVar216);
  auVar240 = vminps_avx(auVar101,auVar233);
  auVar94 = vminps_avx(auVar94,auVar240);
  auVar206 = vhaddps_avx(auVar206,auVar94);
  auVar11 = vmaxps_avx(auVar93,auVar11);
  auVar93 = vmaxps_avx(auVar216,auVar274);
  auVar94 = vmaxps_avx(auVar233,auVar101);
  auVar93 = vmaxps_avx(auVar94,auVar93);
  auVar11 = vhaddps_avx(auVar11,auVar93);
  auVar206 = vshufps_avx(auVar206,auVar206,0xe8);
  auVar11 = vshufps_avx(auVar11,auVar11,0xe8);
  auVar234._0_4_ = auVar147._0_4_ + auVar206._0_4_;
  auVar234._4_4_ = auVar147._4_4_ + auVar206._4_4_;
  auVar234._8_4_ = auVar147._8_4_ + auVar206._8_4_;
  auVar234._12_4_ = auVar147._12_4_ + auVar206._12_4_;
  auVar217._0_4_ = auVar147._0_4_ + auVar11._0_4_;
  auVar217._4_4_ = auVar147._4_4_ + auVar11._4_4_;
  auVar217._8_4_ = auVar147._8_4_ + auVar11._8_4_;
  auVar217._12_4_ = auVar147._12_4_ + auVar11._12_4_;
  auVar220 = ZEXT1664(auVar217);
  auVar206 = vmaxps_avx(auVar66,auVar234);
  auVar11 = vminps_avx(auVar217,auVar246);
  auVar206 = vcmpps_avx(auVar11,auVar206,1);
  auVar206 = vshufps_avx(auVar206,auVar206,0x50);
  if ((auVar206 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0 || auVar206[0xf] < '\0')
  goto LAB_0115b66c;
  bVar51 = 0;
  if ((auVar187._0_4_ < auVar234._0_4_) && (auVar217._0_4_ < auVar246._0_4_)) {
    auVar11 = vmovshdup_avx(auVar234);
    auVar206 = vcmpps_avx(auVar217,auVar246,1);
    bVar51 = auVar206[4] & auVar159._0_4_ < auVar11._0_4_;
  }
  p03.field_0.i[0] = auVar63._0_4_;
  p03.field_0.i[1] = auVar63._4_4_;
  p03.field_0.i[2] = auVar63._8_4_;
  p03.field_0.i[3] = auVar63._12_4_;
  if (((3 < uVar55 || fVar59 < 0.001) | bVar51) == 1) {
    lVar50 = 0xc9;
    auVar220 = ZEXT464(0x40400000);
    do {
      lVar50 = lVar50 + -1;
      if (lVar50 == 0) goto LAB_0115b66c;
      fVar58 = auVar147._0_4_;
      fVar86 = 1.0 - fVar58;
      fVar59 = fVar86 * fVar86 * fVar86;
      fVar87 = fVar58 * 3.0 * fVar86 * fVar86;
      fVar86 = fVar86 * fVar58 * fVar58 * 3.0;
      auVar139._4_4_ = fVar59;
      auVar139._0_4_ = fVar59;
      auVar139._8_4_ = fVar59;
      auVar139._12_4_ = fVar59;
      auVar119._4_4_ = fVar87;
      auVar119._0_4_ = fVar87;
      auVar119._8_4_ = fVar87;
      auVar119._12_4_ = fVar87;
      auVar102._4_4_ = fVar86;
      auVar102._0_4_ = fVar86;
      auVar102._8_4_ = fVar86;
      auVar102._12_4_ = fVar86;
      fVar58 = fVar58 * fVar58 * fVar58;
      auVar154._0_4_ = p03.field_0.v[0] * fVar58;
      auVar154._4_4_ = p03.field_0.v[1] * fVar58;
      auVar154._8_4_ = p03.field_0.v[2] * fVar58;
      auVar154._12_4_ = p03.field_0.v[3] * fVar58;
      auVar105 = vfmadd231ps_fma(auVar154,auVar15,auVar102);
      auVar105 = vfmadd231ps_fma(auVar105,auVar14,auVar119);
      auVar105 = vfmadd231ps_fma(auVar105,auVar13,auVar139);
      auVar103._8_8_ = auVar105._0_8_;
      auVar103._0_8_ = auVar105._0_8_;
      auVar105 = vshufpd_avx(auVar105,auVar105,3);
      auVar206 = vshufps_avx(auVar147,auVar147,0x55);
      auVar105 = vsubps_avx(auVar105,auVar103);
      auVar206 = vfmadd213ps_fma(auVar105,auVar206,auVar103);
      fVar59 = auVar206._0_4_;
      auVar105 = vshufps_avx(auVar206,auVar206,0x55);
      auVar104._0_4_ = fVar120 * fVar59 + fVar85 * auVar105._0_4_;
      auVar104._4_4_ = auVar67._4_4_ * fVar59 + auVar127._4_4_ * auVar105._4_4_;
      auVar104._8_4_ = auVar67._8_4_ * fVar59 + auVar127._8_4_ * auVar105._8_4_;
      auVar104._12_4_ = auVar67._12_4_ * fVar59 + auVar127._12_4_ * auVar105._12_4_;
      auVar147 = vsubps_avx(auVar147,auVar104);
      auVar105 = vandps_avx(auVar238,auVar206);
      auVar206 = vshufps_avx(auVar105,auVar105,0xf5);
      auVar105 = vmaxss_avx(auVar206,auVar105);
    } while (fVar84 <= auVar105._0_4_);
    fVar59 = auVar147._0_4_;
    if ((0.0 <= fVar59) && (fVar59 <= 1.0)) {
      auVar105 = vmovshdup_avx(auVar147);
      fVar87 = auVar105._0_4_;
      if ((0.0 <= fVar87) && (fVar87 <= 1.0)) {
        auVar105 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                 ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c);
        auVar93 = vinsertps_avx(auVar105,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128[2]),0x28);
        auVar105 = vdpps_avx(auVar93,auVar61,0x7f);
        auVar206 = vdpps_avx(auVar93,auVar92,0x7f);
        auVar67 = vdpps_avx(auVar93,auVar121,0x7f);
        auVar127 = vdpps_avx(auVar93,auVar134,0x7f);
        auVar11 = vdpps_avx(auVar93,auVar60,0x7f);
        auVar66 = vdpps_avx(auVar93,auVar90,0x7f);
        auVar246 = vdpps_avx(auVar93,auVar144,0x7f);
        auVar93 = vdpps_avx(auVar93,auVar145,0x7f);
        fVar120 = 1.0 - fVar87;
        auVar105 = vfmadd231ss_fma(ZEXT416((uint)(fVar87 * auVar11._0_4_)),ZEXT416((uint)fVar120),
                                   auVar105);
        auVar206 = vfmadd231ss_fma(ZEXT416((uint)(auVar66._0_4_ * fVar87)),ZEXT416((uint)fVar120),
                                   auVar206);
        auVar67 = vfmadd231ss_fma(ZEXT416((uint)(auVar246._0_4_ * fVar87)),ZEXT416((uint)fVar120),
                                  auVar67);
        auVar220 = ZEXT1664(auVar67);
        auVar127 = vfmadd231ss_fma(ZEXT416((uint)(fVar87 * auVar93._0_4_)),ZEXT416((uint)fVar120),
                                   auVar127);
        fVar58 = 1.0 - fVar59;
        fVar120 = fVar58 * fVar59 * fVar59 * 3.0;
        fVar222 = fVar59 * fVar59 * fVar59;
        auVar67 = vfmadd231ss_fma(ZEXT416((uint)(fVar222 * auVar127._0_4_)),ZEXT416((uint)fVar120),
                                  auVar67);
        fVar85 = fVar59 * 3.0 * fVar58 * fVar58;
        auVar206 = vfmadd231ss_fma(auVar67,ZEXT416((uint)fVar85),auVar206);
        fVar86 = fVar58 * fVar58 * fVar58;
        auVar105 = vfmadd231ss_fma(auVar206,ZEXT416((uint)fVar86),auVar105);
        fVar57 = auVar105._0_4_;
        if (((fVar56 <= fVar57) && (fVar267 = *(float *)(ray + k * 4 + 0x80), fVar57 <= fVar267)) &&
           (pGVar5 = (context->scene->geometries).items[uVar47].ptr,
           (pGVar5->mask & *(uint *)(ray + k * 4 + 0x90)) != 0)) {
          auVar105 = vshufps_avx(auVar147,auVar147,0x55);
          auVar218._8_4_ = 0x3f800000;
          auVar218._0_8_ = 0x3f8000003f800000;
          auVar218._12_4_ = 0x3f800000;
          auVar206 = vsubps_avx(auVar218,auVar105);
          fVar268 = auVar105._0_4_;
          auVar235._0_4_ = fVar268 * auVar226._0_4_;
          fVar188 = auVar105._4_4_;
          auVar235._4_4_ = fVar188 * auVar226._4_4_;
          fVar189 = auVar105._8_4_;
          auVar235._8_4_ = fVar189 * auVar226._8_4_;
          fVar190 = auVar105._12_4_;
          auVar235._12_4_ = fVar190 * auVar226._12_4_;
          auVar243._0_4_ = fVar268 * auVar65._0_4_;
          auVar243._4_4_ = fVar188 * auVar65._4_4_;
          auVar243._8_4_ = fVar189 * auVar65._8_4_;
          auVar243._12_4_ = fVar190 * auVar65._12_4_;
          local_498 = auVar133._0_4_;
          fStack_494 = auVar133._4_4_;
          fStack_490 = auVar133._8_4_;
          fStack_48c = auVar133._12_4_;
          auVar250._0_4_ = fVar268 * local_498;
          auVar250._4_4_ = fVar188 * fStack_494;
          auVar250._8_4_ = fVar189 * fStack_490;
          auVar250._12_4_ = fVar190 * fStack_48c;
          auVar263._0_4_ = fVar268 * fVar157;
          auVar263._4_4_ = fVar188 * fVar173;
          auVar263._8_4_ = fVar189 * fVar174;
          auVar263._12_4_ = fVar190 * fVar175;
          auVar67 = vfmadd231ps_fma(auVar235,auVar206,auVar62);
          auVar127 = vfmadd231ps_fma(auVar243,auVar206,auVar122);
          auVar11 = vfmadd231ps_fma(auVar250,auVar206,auVar91);
          auVar66 = vfmadd231ps_fma(auVar263,auVar206,auVar111);
          auVar206 = vsubps_avx(auVar127,auVar67);
          auVar67 = vsubps_avx(auVar11,auVar127);
          auVar127 = vsubps_avx(auVar66,auVar11);
          local_218._4_4_ = fVar59;
          local_218._0_4_ = fVar59;
          local_218._8_4_ = fVar59;
          local_218._12_4_ = fVar59;
          auVar220 = ZEXT1664(local_218);
          auVar264._0_4_ = fVar59 * auVar67._0_4_;
          auVar264._4_4_ = fVar59 * auVar67._4_4_;
          auVar264._8_4_ = fVar59 * auVar67._8_4_;
          auVar264._12_4_ = fVar59 * auVar67._12_4_;
          auVar200._4_4_ = fVar58;
          auVar200._0_4_ = fVar58;
          auVar200._8_4_ = fVar58;
          auVar200._12_4_ = fVar58;
          auVar206 = vfmadd231ps_fma(auVar264,auVar200,auVar206);
          auVar236._0_4_ = fVar59 * auVar127._0_4_;
          auVar236._4_4_ = fVar59 * auVar127._4_4_;
          auVar236._8_4_ = fVar59 * auVar127._8_4_;
          auVar236._12_4_ = fVar59 * auVar127._12_4_;
          auVar67 = vfmadd231ps_fma(auVar236,auVar200,auVar67);
          auVar237._0_4_ = fVar59 * auVar67._0_4_;
          auVar237._4_4_ = fVar59 * auVar67._4_4_;
          auVar237._8_4_ = fVar59 * auVar67._8_4_;
          auVar237._12_4_ = fVar59 * auVar67._12_4_;
          auVar67 = vfmadd231ps_fma(auVar237,auVar200,auVar206);
          local_368 = auVar205._0_4_;
          fStack_364 = auVar205._4_4_;
          fStack_360 = auVar205._8_4_;
          fStack_35c = auVar205._12_4_;
          auVar183._0_4_ = fVar222 * local_368;
          auVar183._4_4_ = fVar222 * fStack_364;
          auVar183._8_4_ = fVar222 * fStack_360;
          auVar183._12_4_ = fVar222 * fStack_35c;
          auVar140._4_4_ = fVar120;
          auVar140._0_4_ = fVar120;
          auVar140._8_4_ = fVar120;
          auVar140._12_4_ = fVar120;
          auVar206 = vfmadd132ps_fma(auVar140,auVar183,auVar177);
          auVar171._4_4_ = fVar85;
          auVar171._0_4_ = fVar85;
          auVar171._8_4_ = fVar85;
          auVar171._12_4_ = fVar85;
          auVar206 = vfmadd132ps_fma(auVar171,auVar206,auVar176);
          auVar184._0_4_ = auVar67._0_4_ * 3.0;
          auVar184._4_4_ = auVar67._4_4_ * 3.0;
          auVar184._8_4_ = auVar67._8_4_ * 3.0;
          auVar184._12_4_ = auVar67._12_4_ * 3.0;
          auVar155._4_4_ = fVar86;
          auVar155._0_4_ = fVar86;
          auVar155._8_4_ = fVar86;
          auVar155._12_4_ = fVar86;
          auVar67 = vfmadd132ps_fma(auVar155,auVar206,auVar158);
          auVar206 = vshufps_avx(auVar184,auVar184,0xc9);
          auVar141._0_4_ = auVar67._0_4_ * auVar206._0_4_;
          auVar141._4_4_ = auVar67._4_4_ * auVar206._4_4_;
          auVar141._8_4_ = auVar67._8_4_ * auVar206._8_4_;
          auVar141._12_4_ = auVar67._12_4_ * auVar206._12_4_;
          auVar206 = vshufps_avx(auVar67,auVar67,0xc9);
          auVar206 = vfmsub231ps_fma(auVar141,auVar184,auVar206);
          local_228 = auVar206._0_4_;
          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
             (pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
            *(float *)(ray + k * 4 + 0x80) = fVar57;
            uVar54 = vextractps_avx(auVar206,1);
            *(undefined4 *)(ray + k * 4 + 0xc0) = uVar54;
            uVar54 = vextractps_avx(auVar206,2);
            *(undefined4 *)(ray + k * 4 + 0xd0) = uVar54;
            *(undefined4 *)(ray + k * 4 + 0xe0) = local_228;
            *(float *)(ray + k * 4 + 0xf0) = fVar59;
            *(float *)(ray + k * 4 + 0x100) = fVar87;
            *(int *)(ray + k * 4 + 0x110) = (int)local_518;
            *(uint *)(ray + k * 4 + 0x120) = uVar47;
            *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
            *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
          }
          else {
            auVar67 = vshufps_avx(auVar206,auVar206,0x55);
            auVar206 = vshufps_avx(auVar206,auVar206,0xaa);
            local_248[0] = (RTCHitN)auVar67[0];
            local_248[1] = (RTCHitN)auVar67[1];
            local_248[2] = (RTCHitN)auVar67[2];
            local_248[3] = (RTCHitN)auVar67[3];
            local_248[4] = (RTCHitN)auVar67[4];
            local_248[5] = (RTCHitN)auVar67[5];
            local_248[6] = (RTCHitN)auVar67[6];
            local_248[7] = (RTCHitN)auVar67[7];
            local_248[8] = (RTCHitN)auVar67[8];
            local_248[9] = (RTCHitN)auVar67[9];
            local_248[10] = (RTCHitN)auVar67[10];
            local_248[0xb] = (RTCHitN)auVar67[0xb];
            local_248[0xc] = (RTCHitN)auVar67[0xc];
            local_248[0xd] = (RTCHitN)auVar67[0xd];
            local_248[0xe] = (RTCHitN)auVar67[0xe];
            local_248[0xf] = (RTCHitN)auVar67[0xf];
            local_238 = auVar206;
            uStack_224 = local_228;
            uStack_220 = local_228;
            uStack_21c = local_228;
            local_208 = auVar105;
            local_1f8 = CONCAT44(uVar4,uVar4);
            uStack_1f0 = CONCAT44(uVar4,uVar4);
            local_1e8._4_4_ = uVar47;
            local_1e8._0_4_ = uVar47;
            local_1e8._8_4_ = uVar47;
            local_1e8._12_4_ = uVar47;
            vpcmpeqd_avx2(ZEXT1632(local_1e8),ZEXT1632(local_1e8));
            uStack_1d4 = context->user->instID[0];
            local_1d8 = uStack_1d4;
            uStack_1d0 = uStack_1d4;
            uStack_1cc = uStack_1d4;
            uStack_1c8 = context->user->instPrimID[0];
            uStack_1c4 = uStack_1c8;
            uStack_1c0 = uStack_1c8;
            uStack_1bc = uStack_1c8;
            *(float *)(ray + k * 4 + 0x80) = fVar57;
            local_538 = *local_520;
            args.valid = (int *)local_538;
            args.geometryUserPtr = pGVar5->userPtr;
            args.context = context->user;
            args.hit = local_248;
            args.N = 4;
            args.ray = (RTCRayN *)ray;
            if (pGVar5->intersectionFilterN != (RTCFilterFunctionN)0x0) {
              auVar220 = ZEXT1664(local_218);
              (*pGVar5->intersectionFilterN)(&args);
              auVar110._8_56_ = extraout_var;
              auVar110._0_8_ = extraout_XMM1_Qa;
              auVar206 = auVar110._0_16_;
            }
            if (local_538 == (undefined1  [16])0x0) {
              auVar105 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
              auVar206 = vpcmpeqd_avx(auVar206,auVar206);
              auVar105 = auVar105 ^ auVar206;
            }
            else {
              p_Var8 = context->args->filter;
              auVar206 = vpcmpeqd_avx(auVar105,auVar105);
              if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                   RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
                auVar220 = ZEXT1664(auVar220._0_16_);
                (*p_Var8)(&args);
                auVar206 = vpcmpeqd_avx(auVar206,auVar206);
              }
              auVar67 = vpcmpeqd_avx(local_538,_DAT_01f45a50);
              auVar105 = auVar67 ^ auVar206;
              if (local_538 != (undefined1  [16])0x0) {
                auVar67 = auVar67 ^ auVar206;
                auVar206 = vmaskmovps_avx(auVar67,*(undefined1 (*) [16])args.hit);
                *(undefined1 (*) [16])(args.ray + 0xc0) = auVar206;
                auVar206 = vmaskmovps_avx(auVar67,*(undefined1 (*) [16])(args.hit + 0x10));
                *(undefined1 (*) [16])(args.ray + 0xd0) = auVar206;
                auVar206 = vmaskmovps_avx(auVar67,*(undefined1 (*) [16])(args.hit + 0x20));
                *(undefined1 (*) [16])(args.ray + 0xe0) = auVar206;
                auVar206 = vmaskmovps_avx(auVar67,*(undefined1 (*) [16])(args.hit + 0x30));
                *(undefined1 (*) [16])(args.ray + 0xf0) = auVar206;
                auVar206 = vmaskmovps_avx(auVar67,*(undefined1 (*) [16])(args.hit + 0x40));
                *(undefined1 (*) [16])(args.ray + 0x100) = auVar206;
                auVar206 = vmaskmovps_avx(auVar67,*(undefined1 (*) [16])(args.hit + 0x50));
                *(undefined1 (*) [16])(args.ray + 0x110) = auVar206;
                auVar206 = vmaskmovps_avx(auVar67,*(undefined1 (*) [16])(args.hit + 0x60));
                *(undefined1 (*) [16])(args.ray + 0x120) = auVar206;
                auVar206 = vmaskmovps_avx(auVar67,*(undefined1 (*) [16])(args.hit + 0x70));
                *(undefined1 (*) [16])(args.ray + 0x130) = auVar206;
                auVar206 = vmaskmovps_avx(auVar67,*(undefined1 (*) [16])(args.hit + 0x80));
                *(undefined1 (*) [16])(args.ray + 0x140) = auVar206;
              }
            }
            auVar79._8_8_ = 0x100000001;
            auVar79._0_8_ = 0x100000001;
            if ((auVar79 & auVar105) == (undefined1  [16])0x0) {
              *(float *)(ray + k * 4 + 0x80) = fVar267;
            }
          }
        }
      }
    }
    goto LAB_0115b66c;
  }
  auVar105 = vinsertps_avx(auVar105,ZEXT416((uint)fVar87),0x10);
  auVar67 = vinsertps_avx(auVar159,ZEXT416((uint)auVar160._0_4_),0x10);
  goto LAB_0115b0bc;
}

Assistant:

static __forceinline void intersect_hn(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; Vec3fa n0,dn0,n1,dn1; geom->gather_hermite(p0,t0,n0,dn0,p1,t1,n1,dn1,geom->curve(primID));
          Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,n0,dn0,n1,dn1,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }